

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCRayQueryFlags *pRVar7;
  Primitive *pPVar8;
  undefined1 (*pauVar9) [12];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive PVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [16];
  undefined6 uVar62;
  undefined1 auVar63 [12];
  unkbyte9 Var64;
  undefined1 auVar65 [13];
  undefined1 auVar66 [12];
  undefined1 auVar67 [13];
  undefined1 auVar68 [12];
  undefined1 auVar69 [13];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  bool bVar90;
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  bool bVar95;
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  bool bVar100;
  bool bVar101;
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [13];
  undefined1 auVar119 [13];
  undefined1 auVar120 [13];
  undefined1 auVar121 [13];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  ulong uVar126;
  RTCFilterFunctionN p_Var127;
  RTCRayN *pRVar128;
  long lVar129;
  RTCIntersectArguments *pRVar130;
  ulong uVar131;
  long lVar132;
  undefined4 uVar133;
  undefined8 unaff_RBP;
  ulong uVar135;
  byte bVar136;
  long lVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  short sVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar148 [12];
  float fVar205;
  undefined1 auVar153 [16];
  char cVar212;
  undefined1 auVar156 [16];
  undefined1 auVar149 [12];
  undefined1 auVar160 [16];
  undefined1 auVar150 [12];
  undefined1 auVar164 [16];
  undefined1 auVar151 [12];
  undefined1 auVar168 [16];
  float fVar210;
  float fVar213;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar152 [12];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  float fVar211;
  float fVar214;
  undefined8 uVar215;
  float fVar216;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar202;
  undefined1 auVar203 [16];
  float fVar217;
  float fVar218;
  float fVar248;
  float fVar250;
  vfloat4 v;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar249;
  float fVar251;
  float fVar252;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar242;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  int iVar253;
  int iVar254;
  int iVar255;
  char cVar279;
  undefined1 uVar280;
  int iVar281;
  undefined1 auVar259 [16];
  char cVar282;
  undefined1 auVar263 [16];
  undefined1 auVar267 [16];
  undefined1 auVar271 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar291;
  float fVar295;
  undefined1 auVar286 [16];
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar301;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  char cVar324;
  float fVar316;
  float fVar317;
  float fVar325;
  float fVar327;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar326;
  float fVar328;
  float fVar329;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float fVar333;
  float fVar335;
  float fVar337;
  undefined1 auVar330 [16];
  float fVar334;
  float fVar336;
  float fVar338;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar342 [16];
  float fVar350;
  float fVar351;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar360;
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar363;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar364 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar365;
  float fVar371;
  float fVar377;
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar374;
  float fVar378;
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar379;
  float fVar380;
  float fVar390;
  float fVar392;
  float fVar393;
  undefined1 auVar381 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar382;
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  float fVar391;
  undefined1 auVar388 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar389;
  float fVar394;
  float fVar395;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  float fVar406;
  float fVar407;
  float fVar411;
  float fVar412;
  float fVar413;
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  undefined4 local_518;
  float fStack_514;
  float fStack_510;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  char local_4b8;
  char cStack_4b7;
  undefined1 uStack_4b6;
  undefined1 uStack_4b5;
  undefined4 local_468;
  undefined2 uStack_464;
  undefined2 uStack_462;
  undefined2 local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined1 local_3e8 [16];
  Precalculations *local_3d0;
  ulong local_3c8;
  RayQueryContext *local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 (*local_350) [16];
  RTCFilterFunctionNArguments args;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar134;
  undefined1 auVar147 [12];
  undefined1 auVar175 [16];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined2 uVar204;
  int iVar206;
  int iVar207;
  int iVar208;
  int iVar209;
  undefined1 auVar221 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar256 [12];
  undefined1 auVar257 [12];
  undefined1 auVar258 [12];
  undefined1 auVar264 [16];
  undefined1 auVar268 [16];
  undefined1 auVar272 [16];
  undefined1 auVar262 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  
  PVar20 = prim[1];
  uVar126 = (ulong)(byte)PVar20;
  lVar129 = uVar126 * 0x25;
  uVar133 = *(undefined4 *)(prim + uVar126 * 4 + 6);
  uVar21 = *(undefined4 *)(prim + uVar126 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar126 * 6 + 6);
  uVar10 = *(undefined4 *)(prim + uVar126 * 0xf + 6);
  uVar23 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar24 = *(undefined4 *)(prim + uVar126 * 0x11 + 6);
  uVar11 = *(undefined4 *)(prim + uVar126 * 0x1a + 6);
  uVar12 = *(undefined4 *)(prim + uVar126 * 0x1b + 6);
  uVar25 = *(undefined4 *)(prim + uVar126 * 0x1c + 6);
  pPVar8 = prim + lVar129 + 6;
  fVar403 = *(float *)(pPVar8 + 0xc);
  fVar217 = (*(float *)(ray + k * 4) - *(float *)pPVar8) * fVar403;
  fVar248 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar8 + 4)) * fVar403;
  fVar250 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar8 + 8)) * fVar403;
  fVar394 = *(float *)(ray + k * 4 + 0x40) * fVar403;
  fVar401 = *(float *)(ray + k * 4 + 0x50) * fVar403;
  fVar403 = *(float *)(ray + k * 4 + 0x60) * fVar403;
  uVar280 = (undefined1)((uint)uVar21 >> 0x18);
  uVar204 = CONCAT11(uVar280,uVar280);
  uVar280 = (undefined1)((uint)uVar21 >> 0x10);
  uVar215 = CONCAT35(CONCAT21(uVar204,uVar280),CONCAT14(uVar280,uVar21));
  cVar279 = (char)((uint)uVar21 >> 8);
  uVar62 = CONCAT51(CONCAT41((int)((ulong)uVar215 >> 0x20),cVar279),cVar279);
  cVar212 = (char)uVar21;
  uVar134 = CONCAT62(uVar62,CONCAT11(cVar212,cVar212));
  auVar261._8_4_ = 0;
  auVar261._0_8_ = uVar134;
  auVar261._12_2_ = uVar204;
  auVar261._14_2_ = uVar204;
  uVar204 = (undefined2)((ulong)uVar215 >> 0x20);
  auVar260._12_4_ = auVar261._12_4_;
  auVar260._8_2_ = 0;
  auVar260._0_8_ = uVar134;
  auVar260._10_2_ = uVar204;
  auVar259._10_6_ = auVar260._10_6_;
  auVar259._8_2_ = uVar204;
  auVar259._0_8_ = uVar134;
  uVar204 = (undefined2)uVar62;
  auVar63._4_8_ = auVar259._8_8_;
  auVar63._2_2_ = uVar204;
  auVar63._0_2_ = uVar204;
  iVar253 = (int)CONCAT11(cVar212,cVar212) >> 8;
  iVar281 = auVar63._0_4_ >> 0x18;
  auVar256._0_8_ = CONCAT44(iVar281,iVar253);
  auVar256._8_4_ = auVar259._8_4_ >> 0x18;
  auVar262._12_4_ = auVar260._12_4_ >> 0x18;
  auVar262._0_12_ = auVar256;
  fVar377 = (float)iVar281;
  cVar282 = cVar279 >> 7;
  auVar29[0xd] = 0;
  auVar29._0_13_ = auVar262._0_13_;
  auVar29[0xe] = cVar282;
  auVar33[0xc] = cVar282;
  auVar33._0_12_ = auVar256;
  auVar33._13_2_ = auVar29._13_2_;
  auVar37[0xb] = 0;
  auVar37._0_11_ = auVar256._0_11_;
  auVar37._12_3_ = auVar33._12_3_;
  auVar41[10] = cVar282;
  auVar41._0_10_ = auVar256._0_10_;
  auVar41._11_4_ = auVar37._11_4_;
  auVar45[9] = 0;
  auVar45._0_9_ = auVar256._0_9_;
  auVar45._10_5_ = auVar41._10_5_;
  auVar49[8] = cVar279;
  auVar49._0_8_ = auVar256._0_8_;
  auVar49._9_6_ = auVar45._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar49._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar212 >> 7);
  auVar53._6_9_ = Var64;
  auVar53[5] = (char)((uint)uVar22 >> 0x10);
  auVar53[4] = (undefined1)((short)cVar212 >> 7);
  auVar53._0_4_ = iVar253;
  cVar282 = (char)((uint)uVar22 >> 8);
  auVar65._2_11_ = auVar53._4_11_;
  auVar65[1] = cVar282;
  auVar65[0] = (undefined1)((short)cVar212 >> 7);
  cVar279 = (char)uVar22;
  auVar57._2_13_ = auVar65;
  auVar57._0_2_ = CONCAT11(cVar279,cVar212);
  uVar204 = (undefined2)Var64;
  auVar265._0_12_ = auVar57._0_12_;
  auVar265._12_2_ = uVar204;
  auVar265._14_2_ = uVar204;
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._0_10_ = auVar57._0_10_;
  auVar264._10_2_ = auVar53._4_2_;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._0_8_ = auVar57._0_8_;
  auVar263._8_2_ = auVar53._4_2_;
  auVar66._4_8_ = auVar263._8_8_;
  auVar66._2_2_ = auVar65._0_2_;
  auVar66._0_2_ = auVar65._0_2_;
  iVar254 = (int)CONCAT11(cVar279,cVar212) >> 8;
  iVar281 = auVar66._0_4_ >> 0x18;
  auVar257._0_8_ = CONCAT44(iVar281,iVar254);
  auVar257._8_4_ = auVar263._8_4_ >> 0x18;
  auVar266._12_4_ = auVar264._12_4_ >> 0x18;
  auVar266._0_12_ = auVar257;
  fVar417 = (float)iVar281;
  cVar212 = cVar282 >> 7;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar266._0_13_;
  auVar30[0xe] = cVar212;
  auVar34[0xc] = cVar212;
  auVar34._0_12_ = auVar257;
  auVar34._13_2_ = auVar30._13_2_;
  auVar38[0xb] = 0;
  auVar38._0_11_ = auVar257._0_11_;
  auVar38._12_3_ = auVar34._12_3_;
  auVar42[10] = cVar212;
  auVar42._0_10_ = auVar257._0_10_;
  auVar42._11_4_ = auVar38._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar257._0_9_;
  auVar46._10_5_ = auVar42._10_5_;
  auVar50[8] = cVar282;
  auVar50._0_8_ = auVar257._0_8_;
  auVar50._9_6_ = auVar46._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar50._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar279 >> 7);
  auVar54._6_9_ = Var64;
  auVar54[5] = (char)((uint)uVar23 >> 0x10);
  auVar54[4] = (undefined1)((short)cVar279 >> 7);
  auVar54._0_4_ = iVar254;
  cVar324 = (char)((uint)uVar23 >> 8);
  auVar67._2_11_ = auVar54._4_11_;
  auVar67[1] = cVar324;
  auVar67[0] = (undefined1)((short)cVar279 >> 7);
  cVar282 = (char)uVar23;
  auVar58._2_13_ = auVar67;
  auVar58._0_2_ = CONCAT11(cVar282,cVar279);
  uVar204 = (undefined2)Var64;
  auVar269._0_12_ = auVar58._0_12_;
  auVar269._12_2_ = uVar204;
  auVar269._14_2_ = uVar204;
  auVar268._12_4_ = auVar269._12_4_;
  auVar268._0_10_ = auVar58._0_10_;
  auVar268._10_2_ = auVar54._4_2_;
  auVar267._10_6_ = auVar268._10_6_;
  auVar267._0_8_ = auVar58._0_8_;
  auVar267._8_2_ = auVar54._4_2_;
  auVar68._4_8_ = auVar267._8_8_;
  auVar68._2_2_ = auVar67._0_2_;
  auVar68._0_2_ = auVar67._0_2_;
  iVar255 = (int)CONCAT11(cVar282,cVar279) >> 8;
  iVar281 = auVar68._0_4_ >> 0x18;
  auVar258._0_8_ = CONCAT44(iVar281,iVar255);
  auVar258._8_4_ = auVar267._8_4_ >> 0x18;
  auVar270._12_4_ = auVar268._12_4_ >> 0x18;
  auVar270._0_12_ = auVar258;
  fVar366 = (float)iVar281;
  cVar212 = cVar324 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar270._0_13_;
  auVar31[0xe] = cVar212;
  auVar35[0xc] = cVar212;
  auVar35._0_12_ = auVar258;
  auVar35._13_2_ = auVar31._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar258._0_11_;
  auVar39._12_3_ = auVar35._12_3_;
  auVar43[10] = cVar212;
  auVar43._0_10_ = auVar258._0_10_;
  auVar43._11_4_ = auVar39._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar258._0_9_;
  auVar47._10_5_ = auVar43._10_5_;
  auVar51[8] = cVar324;
  auVar51._0_8_ = auVar258._0_8_;
  auVar51._9_6_ = auVar47._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar51._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar282 >> 7);
  auVar55._6_9_ = Var64;
  auVar55[5] = (char)((uint)uVar24 >> 0x10);
  auVar55[4] = (undefined1)((short)cVar282 >> 7);
  auVar55._0_4_ = iVar255;
  auVar69._2_11_ = auVar55._4_11_;
  auVar69[1] = (char)((uint)uVar24 >> 8);
  auVar69[0] = (undefined1)((short)cVar282 >> 7);
  sVar143 = CONCAT11((char)uVar24,cVar282);
  auVar59._2_13_ = auVar69;
  auVar59._0_2_ = sVar143;
  uVar204 = (undefined2)Var64;
  auVar273._0_12_ = auVar59._0_12_;
  auVar273._12_2_ = uVar204;
  auVar273._14_2_ = uVar204;
  auVar272._12_4_ = auVar273._12_4_;
  auVar272._0_10_ = auVar59._0_10_;
  auVar272._10_2_ = auVar55._4_2_;
  auVar271._10_6_ = auVar272._10_6_;
  auVar271._0_8_ = auVar59._0_8_;
  auVar271._8_2_ = auVar55._4_2_;
  auVar70._4_8_ = auVar271._8_8_;
  auVar70._2_2_ = auVar69._0_2_;
  auVar70._0_2_ = auVar69._0_2_;
  fVar301 = (float)((int)sVar143 >> 8);
  fVar313 = (float)(auVar70._0_4_ >> 0x18);
  fVar315 = (float)(auVar271._8_4_ >> 0x18);
  fVar144 = fVar403 * fVar301;
  fVar205 = fVar403 * fVar313;
  auVar147._0_8_ = CONCAT44(fVar205,fVar144);
  auVar147._8_4_ = fVar403 * fVar315;
  auVar173._12_4_ = fVar403 * (float)(auVar272._12_4_ >> 0x18);
  auVar173._0_12_ = auVar147;
  fVar406 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar129 + 0x16)) *
            *(float *)(prim + lVar129 + 0x1a);
  local_4b8 = (char)uVar133;
  cStack_4b7 = (char)((uint)uVar133 >> 8);
  uStack_4b6 = (undefined1)((uint)uVar133 >> 0x10);
  uStack_4b5 = (undefined1)((uint)uVar133 >> 0x18);
  auVar86[0xd] = 0;
  auVar86._0_13_ = auVar173._0_13_;
  auVar86[0xe] = (char)((uint)fVar205 >> 0x18);
  auVar91[0xc] = (char)((uint)fVar205 >> 0x10);
  auVar91._0_12_ = auVar147;
  auVar91._13_2_ = auVar86._13_2_;
  auVar96[0xb] = 0;
  auVar96._0_11_ = auVar147._0_11_;
  auVar96._12_3_ = auVar91._12_3_;
  auVar102[10] = (char)((uint)fVar205 >> 8);
  auVar102._0_10_ = auVar147._0_10_;
  auVar102._11_4_ = auVar96._11_4_;
  auVar106[9] = 0;
  auVar106._0_9_ = auVar147._0_9_;
  auVar106._10_5_ = auVar102._10_5_;
  auVar110[8] = SUB41(fVar205,0);
  auVar110._0_8_ = auVar147._0_8_;
  auVar110._9_6_ = auVar106._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar110._8_7_,uStack_4b5),(char)((uint)fVar144 >> 0x18));
  auVar114._6_9_ = Var64;
  auVar114[5] = uStack_4b6;
  auVar114[4] = (char)((uint)fVar144 >> 0x10);
  auVar114._0_4_ = fVar144;
  auVar118._2_11_ = auVar114._4_11_;
  auVar118[1] = cStack_4b7;
  auVar118[0] = (char)((uint)fVar144 >> 8);
  sVar143 = CONCAT11(local_4b8,SUB41(fVar144,0));
  auVar122._2_13_ = auVar118;
  auVar122._0_2_ = sVar143;
  uVar204 = (undefined2)Var64;
  auVar154._0_12_ = auVar122._0_12_;
  auVar154._12_2_ = uVar204;
  auVar154._14_2_ = uVar204;
  auVar219._12_4_ = auVar154._12_4_;
  auVar219._0_10_ = auVar122._0_10_;
  auVar219._10_2_ = auVar114._4_2_;
  auVar153._10_6_ = auVar219._10_6_;
  auVar153._0_8_ = auVar122._0_8_;
  auVar153._8_2_ = auVar114._4_2_;
  auVar71._4_8_ = auVar153._8_8_;
  auVar71._2_2_ = auVar118._0_2_;
  auVar71._0_2_ = auVar118._0_2_;
  iVar281 = (int)sVar143 >> 8;
  iVar206 = auVar71._0_4_ >> 0x18;
  auVar148._0_8_ = CONCAT44(iVar206,iVar281);
  auVar148._8_4_ = auVar153._8_4_ >> 0x18;
  auVar155._12_4_ = auVar219._12_4_ >> 0x18;
  auVar155._0_12_ = auVar148;
  fVar343 = (float)iVar206;
  local_458._0_1_ = (char)uVar10;
  local_458._1_1_ = (char)((uint)uVar10 >> 8);
  uStack_456._0_1_ = (undefined1)((uint)uVar10 >> 0x10);
  uStack_456._1_1_ = (undefined1)((uint)uVar10 >> 0x18);
  cVar212 = cStack_4b7 >> 7;
  auVar87[0xd] = 0;
  auVar87._0_13_ = auVar155._0_13_;
  auVar87[0xe] = cVar212;
  auVar92[0xc] = cVar212;
  auVar92._0_12_ = auVar148;
  auVar92._13_2_ = auVar87._13_2_;
  auVar97[0xb] = 0;
  auVar97._0_11_ = auVar148._0_11_;
  auVar97._12_3_ = auVar92._12_3_;
  auVar103[10] = cVar212;
  auVar103._0_10_ = auVar148._0_10_;
  auVar103._11_4_ = auVar97._11_4_;
  auVar107[9] = 0;
  auVar107._0_9_ = auVar148._0_9_;
  auVar107._10_5_ = auVar103._10_5_;
  auVar111[8] = cStack_4b7;
  auVar111._0_8_ = auVar148._0_8_;
  auVar111._9_6_ = auVar107._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar111._8_7_,uStack_456._1_1_),(short)local_4b8 >> 7);
  auVar115._6_9_ = Var64;
  auVar115[5] = (undefined1)uStack_456;
  auVar115[4] = (undefined1)((short)local_4b8 >> 7);
  auVar115._0_4_ = iVar281;
  auVar119._2_11_ = auVar115._4_11_;
  auVar119[1] = local_458._1_1_;
  auVar119[0] = (undefined1)((short)local_4b8 >> 7);
  auVar123._2_13_ = auVar119;
  auVar123._0_2_ = CONCAT11((char)local_458,local_4b8);
  uVar204 = (undefined2)Var64;
  auVar158._0_12_ = auVar123._0_12_;
  auVar158._12_2_ = uVar204;
  auVar158._14_2_ = uVar204;
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._0_10_ = auVar123._0_10_;
  auVar157._10_2_ = auVar115._4_2_;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._0_8_ = auVar123._0_8_;
  auVar156._8_2_ = auVar115._4_2_;
  auVar72._4_8_ = auVar156._8_8_;
  auVar72._2_2_ = auVar119._0_2_;
  auVar72._0_2_ = auVar119._0_2_;
  iVar206 = (int)CONCAT11((char)local_458,local_4b8) >> 8;
  iVar207 = auVar72._0_4_ >> 0x18;
  auVar149._0_8_ = CONCAT44(iVar207,iVar206);
  auVar149._8_4_ = auVar156._8_4_ >> 0x18;
  auVar159._12_4_ = auVar157._12_4_ >> 0x18;
  auVar159._0_12_ = auVar149;
  fVar333 = (float)iVar207;
  local_468._0_1_ = (char)uVar11;
  local_468._1_1_ = (char)((uint)uVar11 >> 8);
  local_468._2_1_ = (undefined1)((uint)uVar11 >> 0x10);
  local_468._3_1_ = (undefined1)((uint)uVar11 >> 0x18);
  cVar212 = local_458._1_1_ >> 7;
  auVar88[0xd] = 0;
  auVar88._0_13_ = auVar159._0_13_;
  auVar88[0xe] = cVar212;
  auVar93[0xc] = cVar212;
  auVar93._0_12_ = auVar149;
  auVar93._13_2_ = auVar88._13_2_;
  auVar98[0xb] = 0;
  auVar98._0_11_ = auVar149._0_11_;
  auVar98._12_3_ = auVar93._12_3_;
  auVar104[10] = cVar212;
  auVar104._0_10_ = auVar149._0_10_;
  auVar104._11_4_ = auVar98._11_4_;
  auVar108[9] = 0;
  auVar108._0_9_ = auVar149._0_9_;
  auVar108._10_5_ = auVar104._10_5_;
  auVar112[8] = local_458._1_1_;
  auVar112._0_8_ = auVar149._0_8_;
  auVar112._9_6_ = auVar108._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar112._8_7_,local_468._3_1_),(short)(char)local_458 >> 7);
  auVar116._6_9_ = Var64;
  auVar116[5] = local_468._2_1_;
  auVar116[4] = (undefined1)((short)(char)local_458 >> 7);
  auVar116._0_4_ = iVar206;
  auVar120._2_11_ = auVar116._4_11_;
  auVar120[1] = local_468._1_1_;
  auVar120[0] = (undefined1)((short)(char)local_458 >> 7);
  auVar124._2_13_ = auVar120;
  auVar124._0_2_ = CONCAT11((char)local_468,(char)local_458);
  uVar204 = (undefined2)Var64;
  auVar162._0_12_ = auVar124._0_12_;
  auVar162._12_2_ = uVar204;
  auVar162._14_2_ = uVar204;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar124._0_10_;
  auVar161._10_2_ = auVar116._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar124._0_8_;
  auVar160._8_2_ = auVar116._4_2_;
  auVar73._4_8_ = auVar160._8_8_;
  auVar73._2_2_ = auVar120._0_2_;
  auVar73._0_2_ = auVar120._0_2_;
  iVar207 = (int)CONCAT11((char)local_468,(char)local_458) >> 8;
  iVar208 = auVar73._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar208,iVar207);
  auVar150._8_4_ = auVar160._8_4_ >> 0x18;
  auVar163._12_4_ = auVar161._12_4_ >> 0x18;
  auVar163._0_12_ = auVar150;
  fVar314 = (float)iVar208;
  local_518._0_1_ = (char)uVar12;
  local_518._1_1_ = (char)((uint)uVar12 >> 8);
  local_518._2_1_ = (undefined1)((uint)uVar12 >> 0x10);
  local_518._3_1_ = (undefined1)((uint)uVar12 >> 0x18);
  cVar212 = local_468._1_1_ >> 7;
  auVar89[0xd] = 0;
  auVar89._0_13_ = auVar163._0_13_;
  auVar89[0xe] = cVar212;
  auVar94[0xc] = cVar212;
  auVar94._0_12_ = auVar150;
  auVar94._13_2_ = auVar89._13_2_;
  auVar99[0xb] = 0;
  auVar99._0_11_ = auVar150._0_11_;
  auVar99._12_3_ = auVar94._12_3_;
  auVar105[10] = cVar212;
  auVar105._0_10_ = auVar150._0_10_;
  auVar105._11_4_ = auVar99._11_4_;
  auVar109[9] = 0;
  auVar109._0_9_ = auVar150._0_9_;
  auVar109._10_5_ = auVar105._10_5_;
  auVar113[8] = local_468._1_1_;
  auVar113._0_8_ = auVar150._0_8_;
  auVar113._9_6_ = auVar109._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar113._8_7_,local_518._3_1_),(short)(char)local_468 >> 7);
  auVar117._6_9_ = Var64;
  auVar117[5] = local_518._2_1_;
  auVar117[4] = (undefined1)((short)(char)local_468 >> 7);
  auVar117._0_4_ = iVar207;
  auVar121._2_11_ = auVar117._4_11_;
  auVar121[1] = local_518._1_1_;
  auVar121[0] = (undefined1)((short)(char)local_468 >> 7);
  auVar125._2_13_ = auVar121;
  auVar125._0_2_ = CONCAT11((char)local_518,(char)local_468);
  uVar204 = (undefined2)Var64;
  auVar166._0_12_ = auVar125._0_12_;
  auVar166._12_2_ = uVar204;
  auVar166._14_2_ = uVar204;
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._0_10_ = auVar125._0_10_;
  auVar165._10_2_ = auVar117._4_2_;
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._0_8_ = auVar125._0_8_;
  auVar164._8_2_ = auVar117._4_2_;
  auVar74._4_8_ = auVar164._8_8_;
  auVar74._2_2_ = auVar121._0_2_;
  auVar74._0_2_ = auVar121._0_2_;
  iVar208 = (int)CONCAT11((char)local_518,(char)local_468) >> 8;
  iVar209 = auVar74._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar209,iVar208);
  auVar151._8_4_ = auVar164._8_4_ >> 0x18;
  auVar167._12_4_ = auVar165._12_4_ >> 0x18;
  auVar167._0_12_ = auVar151;
  fVar291 = (float)iVar209;
  cVar212 = local_518._1_1_ >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar167._0_13_;
  auVar32[0xe] = cVar212;
  auVar36[0xc] = cVar212;
  auVar36._0_12_ = auVar151;
  auVar36._13_2_ = auVar32._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar151._0_11_;
  auVar40._12_3_ = auVar36._12_3_;
  auVar44[10] = cVar212;
  auVar44._0_10_ = auVar151._0_10_;
  auVar44._11_4_ = auVar40._11_4_;
  auVar48[9] = 0;
  auVar48._0_9_ = auVar151._0_9_;
  auVar48._10_5_ = auVar44._10_5_;
  auVar52[8] = local_518._1_1_;
  auVar52._0_8_ = auVar151._0_8_;
  auVar52._9_6_ = auVar48._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar52._8_7_,(char)((uint)uVar25 >> 0x18)),(short)(char)local_518 >> 7)
  ;
  auVar56._6_9_ = Var64;
  auVar56[5] = (char)((uint)uVar25 >> 0x10);
  auVar56[4] = (undefined1)((short)(char)local_518 >> 7);
  auVar56._0_4_ = iVar208;
  auVar75._2_11_ = auVar56._4_11_;
  auVar75[1] = (char)((uint)uVar25 >> 8);
  auVar75[0] = (undefined1)((short)(char)local_518 >> 7);
  sVar143 = CONCAT11((char)uVar25,(char)local_518);
  auVar60._2_13_ = auVar75;
  auVar60._0_2_ = sVar143;
  uVar204 = (undefined2)Var64;
  auVar170._0_12_ = auVar60._0_12_;
  auVar170._12_2_ = uVar204;
  auVar170._14_2_ = uVar204;
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._0_10_ = auVar60._0_10_;
  auVar169._10_2_ = auVar56._4_2_;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._0_8_ = auVar60._0_8_;
  auVar168._8_2_ = auVar56._4_2_;
  auVar76._4_8_ = auVar168._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  fVar145 = (float)((int)sVar143 >> 8);
  fVar210 = (float)(auVar76._0_4_ >> 0x18);
  fVar213 = (float)(auVar168._8_4_ >> 0x18);
  fVar395 = fVar394 * (float)iVar281 + fVar401 * (float)iVar253 + fVar403 * (float)iVar254;
  fVar402 = fVar394 * fVar343 + fVar401 * fVar377 + fVar403 * fVar417;
  fVar404 = fVar394 * (float)auVar148._8_4_ +
            fVar401 * (float)auVar256._8_4_ + fVar403 * (float)auVar257._8_4_;
  fVar405 = fVar394 * (float)auVar155._12_4_ +
            fVar401 * (float)auVar262._12_4_ + fVar403 * (float)auVar266._12_4_;
  fVar379 = fVar394 * (float)iVar206 + fVar401 * (float)iVar255 + fVar144;
  fVar390 = fVar394 * fVar333 + fVar401 * fVar366 + fVar205;
  fVar392 = fVar394 * (float)auVar149._8_4_ + fVar401 * (float)auVar258._8_4_ + auVar147._8_4_;
  fVar393 = fVar394 * (float)auVar159._12_4_ + fVar401 * (float)auVar270._12_4_ + auVar173._12_4_;
  fVar316 = fVar394 * (float)iVar207 + fVar401 * (float)iVar208 + fVar403 * fVar145;
  fVar325 = fVar394 * fVar314 + fVar401 * fVar291 + fVar403 * fVar210;
  fVar327 = fVar394 * (float)auVar150._8_4_ + fVar401 * (float)auVar151._8_4_ + fVar403 * fVar213;
  fVar394 = fVar394 * (float)auVar163._12_4_ +
            fVar401 * (float)auVar167._12_4_ + fVar403 * (float)(auVar169._12_4_ >> 0x18);
  uVar215 = *(undefined8 *)(prim + uVar126 * 7 + 6);
  uVar13 = *(undefined8 *)(prim + uVar126 * 0xb + 6);
  uVar14 = *(undefined8 *)(prim + uVar126 * 9 + 6);
  fVar339 = (float)iVar281 * fVar217 + (float)iVar253 * fVar248 + (float)iVar254 * fVar250;
  fVar417 = fVar343 * fVar217 + fVar377 * fVar248 + fVar417 * fVar250;
  fVar346 = (float)auVar148._8_4_ * fVar217 +
            (float)auVar256._8_4_ * fVar248 + (float)auVar257._8_4_ * fVar250;
  fVar348 = (float)auVar155._12_4_ * fVar217 +
            (float)auVar262._12_4_ * fVar248 + (float)auVar266._12_4_ * fVar250;
  fVar350 = (float)iVar206 * fVar217 + (float)iVar255 * fVar248 + fVar301 * fVar250;
  fVar355 = fVar333 * fVar217 + fVar366 * fVar248 + fVar313 * fVar250;
  fVar357 = (float)auVar149._8_4_ * fVar217 + (float)auVar258._8_4_ * fVar248 + fVar315 * fVar250;
  fVar359 = (float)auVar159._12_4_ * fVar217 +
            (float)auVar270._12_4_ * fVar248 + (float)(auVar272._12_4_ >> 0x18) * fVar250;
  fVar343 = fVar217 * (float)iVar207 + fVar248 * (float)iVar208 + fVar250 * fVar145;
  fVar366 = fVar217 * fVar314 + fVar248 * fVar291 + fVar250 * fVar210;
  fVar377 = fVar217 * (float)auVar150._8_4_ + fVar248 * (float)auVar151._8_4_ + fVar250 * fVar213;
  fVar401 = fVar217 * (float)auVar163._12_4_ +
            fVar248 * (float)auVar167._12_4_ + fVar250 * (float)(auVar169._12_4_ >> 0x18);
  fVar403 = (float)DAT_01f4bd50;
  fVar144 = DAT_01f4bd50._4_4_;
  fVar145 = DAT_01f4bd50._8_4_;
  fVar205 = DAT_01f4bd50._12_4_;
  uVar138 = -(uint)(fVar403 <= ABS(fVar395));
  uVar139 = -(uint)(fVar144 <= ABS(fVar402));
  uVar140 = -(uint)(fVar145 <= ABS(fVar404));
  uVar141 = -(uint)(fVar205 <= ABS(fVar405));
  auVar396._0_4_ = (uint)fVar395 & uVar138;
  auVar396._4_4_ = (uint)fVar402 & uVar139;
  auVar396._8_4_ = (uint)fVar404 & uVar140;
  auVar396._12_4_ = (uint)fVar405 & uVar141;
  auVar171._0_4_ = ~uVar138 & (uint)fVar403;
  auVar171._4_4_ = ~uVar139 & (uint)fVar144;
  auVar171._8_4_ = ~uVar140 & (uint)fVar145;
  auVar171._12_4_ = ~uVar141 & (uint)fVar205;
  auVar171 = auVar171 | auVar396;
  uVar138 = -(uint)(fVar403 <= ABS(fVar379));
  uVar139 = -(uint)(fVar144 <= ABS(fVar390));
  uVar140 = -(uint)(fVar145 <= ABS(fVar392));
  uVar141 = -(uint)(fVar205 <= ABS(fVar393));
  auVar381._0_4_ = (uint)fVar379 & uVar138;
  auVar381._4_4_ = (uint)fVar390 & uVar139;
  auVar381._8_4_ = (uint)fVar392 & uVar140;
  auVar381._12_4_ = (uint)fVar393 & uVar141;
  auVar302._0_4_ = ~uVar138 & (uint)fVar403;
  auVar302._4_4_ = ~uVar139 & (uint)fVar144;
  auVar302._8_4_ = ~uVar140 & (uint)fVar145;
  auVar302._12_4_ = ~uVar141 & (uint)fVar205;
  auVar302 = auVar302 | auVar381;
  uVar138 = -(uint)(fVar403 <= ABS(fVar316));
  uVar139 = -(uint)(fVar144 <= ABS(fVar325));
  uVar140 = -(uint)(fVar145 <= ABS(fVar327));
  uVar141 = -(uint)(fVar205 <= ABS(fVar394));
  auVar318._0_4_ = (uint)fVar316 & uVar138;
  auVar318._4_4_ = (uint)fVar325 & uVar139;
  auVar318._8_4_ = (uint)fVar327 & uVar140;
  auVar318._12_4_ = (uint)fVar394 & uVar141;
  auVar372._0_4_ = ~uVar138 & (uint)fVar403;
  auVar372._4_4_ = ~uVar139 & (uint)fVar144;
  auVar372._8_4_ = ~uVar140 & (uint)fVar145;
  auVar372._12_4_ = ~uVar141 & (uint)fVar205;
  auVar372 = auVar372 | auVar318;
  auVar219 = rcpps(_DAT_01f4bd50,auVar171);
  auVar220._0_4_ = auVar219._0_4_;
  auVar172._0_4_ = auVar171._0_4_ * auVar220._0_4_;
  fVar327 = auVar219._4_4_;
  auVar172._4_4_ = auVar171._4_4_ * fVar327;
  fVar394 = auVar219._8_4_;
  auVar172._8_4_ = auVar171._8_4_ * fVar394;
  fVar333 = auVar219._12_4_;
  auVar172._12_4_ = auVar171._12_4_ * fVar333;
  fVar379 = (1.0 - auVar172._0_4_) * auVar220._0_4_ + auVar220._0_4_;
  fVar327 = (1.0 - auVar172._4_4_) * fVar327 + fVar327;
  fVar394 = (1.0 - auVar172._8_4_) * fVar394 + fVar394;
  fVar333 = (1.0 - auVar172._12_4_) * fVar333 + fVar333;
  auVar173 = rcpps(auVar172,auVar302);
  fVar403 = auVar173._0_4_;
  fVar144 = auVar173._4_4_;
  fVar250 = auVar173._8_4_;
  fVar316 = auVar173._12_4_;
  fVar403 = (1.0 - auVar302._0_4_ * fVar403) * fVar403 + fVar403;
  fVar144 = (1.0 - auVar302._4_4_ * fVar144) * fVar144 + fVar144;
  fVar250 = (1.0 - auVar302._8_4_ * fVar250) * fVar250 + fVar250;
  fVar316 = (1.0 - auVar302._12_4_ * fVar316) * fVar316 + fVar316;
  auVar173 = rcpps(auVar173,auVar372);
  auVar174._0_4_ = auVar173._0_4_;
  fVar145 = auVar173._4_4_;
  fVar291 = auVar173._8_4_;
  fVar325 = auVar173._12_4_;
  fVar390 = (1.0 - auVar372._0_4_ * auVar174._0_4_) * auVar174._0_4_ + auVar174._0_4_;
  fVar145 = (1.0 - auVar372._4_4_ * fVar145) * fVar145 + fVar145;
  fVar291 = (1.0 - auVar372._8_4_ * fVar291) * fVar291 + fVar291;
  fVar325 = (1.0 - auVar372._12_4_ * fVar325) * fVar325 + fVar325;
  local_458 = (short)uVar215;
  uStack_456 = (undefined2)((ulong)uVar215 >> 0x10);
  uStack_454 = (undefined2)((ulong)uVar215 >> 0x20);
  uStack_452 = (undefined2)((ulong)uVar215 >> 0x30);
  auVar177._0_12_ = auVar173._0_12_;
  auVar177._12_2_ = auVar173._6_2_;
  auVar177._14_2_ = uStack_452;
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._0_10_ = auVar173._0_10_;
  auVar176._10_2_ = uStack_454;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._0_8_ = auVar173._0_8_;
  auVar175._8_2_ = auVar173._4_2_;
  auVar174._8_8_ = auVar175._8_8_;
  auVar174._6_2_ = uStack_456;
  auVar174._4_2_ = auVar173._2_2_;
  auVar178._0_4_ = (float)(int)local_458;
  fVar205 = (float)(auVar174._4_4_ >> 0x10);
  auVar152._0_8_ = CONCAT44(fVar205,auVar178._0_4_);
  auVar152._8_4_ = (float)(auVar175._8_4_ >> 0x10);
  local_468._0_2_ = (short)uVar13;
  local_468._2_2_ = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_464 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_462 = (undefined2)((ulong)uVar13 >> 0x30);
  auVar223._0_12_ = auVar219._0_12_;
  auVar223._12_2_ = auVar219._6_2_;
  auVar223._14_2_ = uStack_462;
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._0_10_ = auVar219._0_10_;
  auVar222._10_2_ = uStack_464;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._0_8_ = auVar219._0_8_;
  auVar221._8_2_ = auVar219._4_2_;
  auVar220._8_8_ = auVar221._8_8_;
  auVar220._6_2_ = local_468._2_2_;
  auVar220._4_2_ = auVar219._2_2_;
  auVar181._12_2_ = (short)((uint)fVar205 >> 0x10);
  auVar181._0_12_ = auVar152;
  auVar181._14_2_ = (short)((ulong)uVar14 >> 0x30);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._0_10_ = auVar152._0_10_;
  auVar180._10_2_ = (short)((ulong)uVar14 >> 0x20);
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = SUB42(fVar205,0);
  auVar179._0_8_ = auVar152._0_8_;
  auVar178._8_8_ = auVar179._8_8_;
  auVar178._6_2_ = (short)((ulong)uVar14 >> 0x10);
  auVar178._4_2_ = (short)((uint)auVar178._0_4_ >> 0x10);
  fVar210 = (float)(auVar178._4_4_ >> 0x10);
  fVar301 = (float)(auVar179._8_4_ >> 0x10);
  uVar134 = *(ulong *)(prim + uVar126 * 0xd + 6);
  uVar204 = (undefined2)(uVar134 >> 0x30);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar134;
  auVar226._12_2_ = uVar204;
  auVar226._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar134 >> 0x20);
  auVar225._12_4_ = auVar226._12_4_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar134;
  auVar225._10_2_ = uVar204;
  auVar224._10_6_ = auVar225._10_6_;
  auVar224._8_2_ = uVar204;
  auVar224._0_8_ = uVar134;
  uVar204 = (undefined2)(uVar134 >> 0x10);
  auVar77._4_8_ = auVar224._8_8_;
  auVar77._2_2_ = uVar204;
  auVar77._0_2_ = uVar204;
  uVar135 = *(ulong *)(prim + uVar126 * 0x12 + 6);
  uVar204 = (undefined2)(uVar135 >> 0x30);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar135;
  auVar184._12_2_ = uVar204;
  auVar184._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar135 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar135;
  auVar183._10_2_ = uVar204;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar204;
  auVar182._0_8_ = uVar135;
  uVar204 = (undefined2)(uVar135 >> 0x10);
  auVar78._4_8_ = auVar182._8_8_;
  auVar78._2_2_ = uVar204;
  auVar78._0_2_ = uVar204;
  fVar213 = (float)(auVar78._0_4_ >> 0x10);
  fVar313 = (float)(auVar182._8_4_ >> 0x10);
  uVar131 = *(ulong *)(prim + uVar126 * 0x16 + 6);
  uVar204 = (undefined2)(uVar131 >> 0x30);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar131;
  auVar229._12_2_ = uVar204;
  auVar229._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar131 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar131;
  auVar228._10_2_ = uVar204;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar204;
  auVar227._0_8_ = uVar131;
  uVar204 = (undefined2)(uVar131 >> 0x10);
  auVar79._4_8_ = auVar227._8_8_;
  auVar79._2_2_ = uVar204;
  auVar79._0_2_ = uVar204;
  uVar15 = *(ulong *)(prim + uVar126 * 0x14 + 6);
  uVar204 = (undefined2)(uVar15 >> 0x30);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar15;
  auVar187._12_2_ = uVar204;
  auVar187._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar15 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar15;
  auVar186._10_2_ = uVar204;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar204;
  auVar185._0_8_ = uVar15;
  uVar204 = (undefined2)(uVar15 >> 0x10);
  auVar80._4_8_ = auVar185._8_8_;
  auVar80._2_2_ = uVar204;
  auVar80._0_2_ = uVar204;
  fVar217 = (float)(auVar80._0_4_ >> 0x10);
  fVar314 = (float)(auVar185._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar126 * 0x18 + 6);
  uVar204 = (undefined2)(uVar16 >> 0x30);
  auVar232._8_4_ = 0;
  auVar232._0_8_ = uVar16;
  auVar232._12_2_ = uVar204;
  auVar232._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar16 >> 0x20);
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._8_2_ = 0;
  auVar231._0_8_ = uVar16;
  auVar231._10_2_ = uVar204;
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._8_2_ = uVar204;
  auVar230._0_8_ = uVar16;
  uVar204 = (undefined2)(uVar16 >> 0x10);
  auVar81._4_8_ = auVar230._8_8_;
  auVar81._2_2_ = uVar204;
  auVar81._0_2_ = uVar204;
  uVar17 = *(ulong *)(prim + uVar126 * 0x1d + 6);
  uVar204 = (undefined2)(uVar17 >> 0x30);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar17;
  auVar190._12_2_ = uVar204;
  auVar190._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar17 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar17;
  auVar189._10_2_ = uVar204;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar204;
  auVar188._0_8_ = uVar17;
  uVar204 = (undefined2)(uVar17 >> 0x10);
  auVar82._4_8_ = auVar188._8_8_;
  auVar82._2_2_ = uVar204;
  auVar82._0_2_ = uVar204;
  fVar248 = (float)(auVar82._0_4_ >> 0x10);
  fVar315 = (float)(auVar188._8_4_ >> 0x10);
  uVar18 = *(ulong *)(prim + uVar126 * 0x21 + 6);
  uVar204 = (undefined2)(uVar18 >> 0x30);
  auVar235._8_4_ = 0;
  auVar235._0_8_ = uVar18;
  auVar235._12_2_ = uVar204;
  auVar235._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar18 >> 0x20);
  auVar234._12_4_ = auVar235._12_4_;
  auVar234._8_2_ = 0;
  auVar234._0_8_ = uVar18;
  auVar234._10_2_ = uVar204;
  auVar233._10_6_ = auVar234._10_6_;
  auVar233._8_2_ = uVar204;
  auVar233._0_8_ = uVar18;
  uVar204 = (undefined2)(uVar18 >> 0x10);
  auVar83._4_8_ = auVar233._8_8_;
  auVar83._2_2_ = uVar204;
  auVar83._0_2_ = uVar204;
  uVar19 = *(ulong *)(prim + uVar126 * 0x1f + 6);
  uVar204 = (undefined2)(uVar19 >> 0x30);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar19;
  auVar193._12_2_ = uVar204;
  auVar193._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar19 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar19;
  auVar192._10_2_ = uVar204;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar204;
  auVar191._0_8_ = uVar19;
  uVar204 = (undefined2)(uVar19 >> 0x10);
  auVar84._4_8_ = auVar191._8_8_;
  auVar84._2_2_ = uVar204;
  auVar84._0_2_ = uVar204;
  fVar392 = (float)(auVar84._0_4_ >> 0x10);
  fVar393 = (float)(auVar191._8_4_ >> 0x10);
  uVar126 = *(ulong *)(prim + uVar126 * 0x23 + 6);
  uVar204 = (undefined2)(uVar126 >> 0x30);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar126;
  auVar196._12_2_ = uVar204;
  auVar196._14_2_ = uVar204;
  uVar204 = (undefined2)(uVar126 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar126;
  auVar195._10_2_ = uVar204;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar204;
  auVar194._0_8_ = uVar126;
  uVar204 = (undefined2)(uVar126 >> 0x10);
  auVar85._4_8_ = auVar194._8_8_;
  auVar85._2_2_ = uVar204;
  auVar85._0_2_ = uVar204;
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar303._0_8_ =
       CONCAT44(((((float)(auVar220._4_4_ >> 0x10) - fVar205) * fVar406 + fVar205) - fVar417) *
                fVar327,((((float)(int)(short)local_468 - auVar178._0_4_) * fVar406 + auVar178._0_4_
                         ) - fVar339) * fVar379);
  auVar303._8_4_ =
       ((((float)(auVar221._8_4_ >> 0x10) - auVar152._8_4_) * fVar406 + auVar152._8_4_) - fVar346) *
       fVar394;
  auVar303._12_4_ =
       ((((float)(auVar222._12_4_ >> 0x10) - (float)(auVar176._12_4_ >> 0x10)) * fVar406 +
        (float)(auVar176._12_4_ >> 0x10)) - fVar348) * fVar333;
  auVar352._0_4_ =
       ((((float)(int)(short)uVar134 - (float)(int)(short)uVar14) * fVar406 +
        (float)(int)(short)uVar14) - fVar339) * fVar379;
  auVar352._4_4_ =
       ((((float)(auVar77._0_4_ >> 0x10) - fVar210) * fVar406 + fVar210) - fVar417) * fVar327;
  auVar352._8_4_ =
       ((((float)(auVar224._8_4_ >> 0x10) - fVar301) * fVar406 + fVar301) - fVar346) * fVar394;
  auVar352._12_4_ =
       ((((float)(auVar225._12_4_ >> 0x10) - (float)(auVar180._12_4_ >> 0x10)) * fVar406 +
        (float)(auVar180._12_4_ >> 0x10)) - fVar348) * fVar333;
  auVar361._0_8_ =
       CONCAT44(((((float)(auVar79._0_4_ >> 0x10) - fVar213) * fVar406 + fVar213) - fVar355) *
                fVar144,((((float)(int)(short)uVar131 - (float)(int)(short)uVar135) * fVar406 +
                         (float)(int)(short)uVar135) - fVar350) * fVar403);
  auVar361._8_4_ =
       ((((float)(auVar227._8_4_ >> 0x10) - fVar313) * fVar406 + fVar313) - fVar357) * fVar250;
  auVar361._12_4_ =
       ((((float)(auVar228._12_4_ >> 0x10) - (float)(auVar183._12_4_ >> 0x10)) * fVar406 +
        (float)(auVar183._12_4_ >> 0x10)) - fVar359) * fVar316;
  aVar365._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar406 +
        (float)(int)(short)uVar15) - fVar350) * fVar403;
  aVar365._4_4_ =
       ((((float)(auVar81._0_4_ >> 0x10) - fVar217) * fVar406 + fVar217) - fVar355) * fVar144;
  aVar365._8_4_ =
       ((((float)(auVar230._8_4_ >> 0x10) - fVar314) * fVar406 + fVar314) - fVar357) * fVar250;
  aVar365._12_4_ =
       ((((float)(auVar231._12_4_ >> 0x10) - (float)(auVar186._12_4_ >> 0x10)) * fVar406 +
        (float)(auVar186._12_4_ >> 0x10)) - fVar359) * fVar316;
  auVar373._0_8_ =
       CONCAT44(((((float)(auVar83._0_4_ >> 0x10) - fVar248) * fVar406 + fVar248) - fVar366) *
                fVar145,((((float)(int)(short)uVar18 - (float)(int)(short)uVar17) * fVar406 +
                         (float)(int)(short)uVar17) - fVar343) * fVar390);
  auVar373._8_4_ =
       ((((float)(auVar233._8_4_ >> 0x10) - fVar315) * fVar406 + fVar315) - fVar377) * fVar291;
  auVar373._12_4_ =
       ((((float)(auVar234._12_4_ >> 0x10) - (float)(auVar189._12_4_ >> 0x10)) * fVar406 +
        (float)(auVar189._12_4_ >> 0x10)) - fVar401) * fVar325;
  aVar382._0_4_ =
       ((((float)(int)(short)uVar126 - (float)(int)(short)uVar19) * fVar406 +
        (float)(int)(short)uVar19) - fVar343) * fVar390;
  aVar382._4_4_ =
       ((((float)(auVar85._0_4_ >> 0x10) - fVar392) * fVar406 + fVar392) - fVar366) * fVar145;
  aVar382._8_4_ =
       ((((float)(auVar194._8_4_ >> 0x10) - fVar393) * fVar406 + fVar393) - fVar377) * fVar291;
  aVar382._12_4_ =
       ((((float)(auVar195._12_4_ >> 0x10) - (float)(auVar192._12_4_ >> 0x10)) * fVar406 +
        (float)(auVar192._12_4_ >> 0x10)) - fVar401) * fVar325;
  auVar286._8_4_ = auVar303._8_4_;
  auVar286._0_8_ = auVar303._0_8_;
  auVar286._12_4_ = auVar303._12_4_;
  auVar219 = minps(auVar286,auVar352);
  auVar274._8_4_ = auVar361._8_4_;
  auVar274._0_8_ = auVar361._0_8_;
  auVar274._12_4_ = auVar361._12_4_;
  auVar173 = minps(auVar274,(undefined1  [16])aVar365);
  auVar219 = maxps(auVar219,auVar173);
  auVar275._8_4_ = auVar373._8_4_;
  auVar275._0_8_ = auVar373._0_8_;
  auVar275._12_4_ = auVar373._12_4_;
  auVar173 = minps(auVar275,(undefined1  [16])aVar382);
  auVar236._4_4_ = uVar133;
  auVar236._0_4_ = uVar133;
  auVar236._8_4_ = uVar133;
  auVar236._12_4_ = uVar133;
  auVar173 = maxps(auVar173,auVar236);
  auVar173 = maxps(auVar219,auVar173);
  fVar403 = auVar173._0_4_ * 0.99999964;
  fVar144 = auVar173._4_4_ * 0.99999964;
  fVar145 = auVar173._8_4_ * 0.99999964;
  fVar205 = auVar173._12_4_ * 0.99999964;
  auVar173 = maxps(auVar303,auVar352);
  auVar219 = maxps(auVar361,(undefined1  [16])aVar365);
  auVar173 = minps(auVar173,auVar219);
  auVar219 = maxps(auVar373,(undefined1  [16])aVar382);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar237._4_4_ = uVar133;
  auVar237._0_4_ = uVar133;
  auVar237._8_4_ = uVar133;
  auVar237._12_4_ = uVar133;
  aVar374 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar219,auVar237);
  auVar173 = minps(auVar173,(undefined1  [16])aVar374);
  auVar238._0_4_ = -(uint)(PVar20 != (Primitive)0x0 && fVar403 <= auVar173._0_4_ * 1.0000004);
  auVar238._4_4_ = -(uint)(1 < (byte)PVar20 && fVar144 <= auVar173._4_4_ * 1.0000004);
  auVar238._8_4_ = -(uint)(2 < (byte)PVar20 && fVar145 <= auVar173._8_4_ * 1.0000004);
  auVar238._12_4_ = -(uint)(3 < (byte)PVar20 && fVar205 <= auVar173._12_4_ * 1.0000004);
  uVar133 = movmskps((int)unaff_RBP,auVar238);
  local_3b8 = mm_lookupmask_ps._0_8_;
  uStack_3b0 = mm_lookupmask_ps._8_8_;
  local_350 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3d0 = pre;
  local_3c0 = context;
  local_48 = fVar403;
  fStack_44 = fVar144;
  fStack_40 = fVar145;
  fStack_3c = fVar205;
  for (uVar134 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar133); uVar134 != 0;
      uVar134 = (ulong)((uint)uVar134 & (uint)uVar134 + 0xf & uVar138)) {
    lVar129 = 0;
    if (uVar134 != 0) {
      for (; (uVar134 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
      }
    }
    local_3c8 = (ulong)*(uint *)(prim + 2);
    uVar138 = *(uint *)(prim + lVar129 * 4 + 6);
    pGVar26 = (context->scene->geometries).items[local_3c8].ptr;
    uVar135 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                              (ulong)uVar138 *
                              pGVar26[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar210 = pGVar26->fnumTimeSegments;
    fVar213 = (pGVar26->time_range).lower;
    fVar217 = ((*(float *)(ray + k * 4 + 0x70) - fVar213) / ((pGVar26->time_range).upper - fVar213))
              * fVar210;
    fVar213 = floorf(fVar217);
    context = local_3c0;
    fVar210 = fVar210 + -1.0;
    if (fVar210 <= fVar213) {
      fVar213 = fVar210;
    }
    fVar210 = 0.0;
    if (0.0 <= fVar213) {
      fVar210 = fVar213;
    }
    _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar137 = (long)(int)fVar210 * 0x38;
    lVar129 = *(long *)(_Var27 + lVar137);
    lVar132 = *(long *)(_Var27 + 0x10 + lVar137);
    uVar131 = *(ulong *)(_Var27 + 0x38 + lVar137);
    lVar137 = *(long *)(_Var27 + 0x48 + lVar137);
    pRVar130 = (RTCIntersectArguments *)(lVar132 * (uVar135 + 3));
    pfVar1 = (float *)(uVar131 + uVar135 * lVar137);
    pfVar2 = (float *)(lVar129 + lVar132 * uVar135);
    pfVar3 = (float *)(uVar131 + (uVar135 + 1) * lVar137);
    pfVar4 = (float *)(lVar129 + lVar132 * (uVar135 + 1));
    pfVar5 = (float *)(uVar131 + (uVar135 + 2) * lVar137);
    pfVar6 = (float *)(lVar129 + lVar132 * (uVar135 + 2));
    fVar217 = fVar217 - fVar210;
    fVar210 = 1.0 - fVar217;
    fVar379 = *pfVar2 * fVar210 + *pfVar1 * fVar217;
    fVar339 = pfVar2[1] * fVar210 + pfVar1[1] * fVar217;
    fVar390 = pfVar2[2] * fVar210 + pfVar1[2] * fVar217;
    fVar417 = pfVar2[3] * fVar210 + pfVar1[3] * fVar217;
    fVar402 = *pfVar4 * fVar210 + *pfVar3 * fVar217;
    fVar404 = pfVar4[1] * fVar210 + pfVar3[1] * fVar217;
    fVar405 = pfVar4[2] * fVar210 + pfVar3[2] * fVar217;
    fVar406 = pfVar4[3] * fVar210 + pfVar3[3] * fVar217;
    pfVar1 = (float *)(uVar131 + lVar137 * (uVar135 + 3));
    pfVar2 = (float *)((long)&pRVar130->flags + lVar129);
    fVar357 = *pfVar6 * fVar210 + *pfVar5 * fVar217;
    fVar359 = pfVar6[1] * fVar210 + pfVar5[1] * fVar217;
    fVar392 = pfVar6[2] * fVar210 + pfVar5[2] * fVar217;
    fVar393 = pfVar6[3] * fVar210 + pfVar5[3] * fVar217;
    fVar346 = fVar210 * *pfVar2 + fVar217 * *pfVar1;
    fVar348 = fVar210 * pfVar2[1] + fVar217 * pfVar1[1];
    fVar350 = fVar210 * pfVar2[2] + fVar217 * pfVar1[2];
    fVar355 = fVar210 * pfVar2[3] + fVar217 * pfVar1[3];
    iVar281 = (int)pGVar26[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar210 = *(float *)(ray + k * 4);
    fVar213 = *(float *)(ray + k * 4 + 0x10);
    fVar217 = *(float *)(ray + k * 4 + 0x20);
    fVar327 = fVar379 - fVar210;
    fVar394 = fVar339 - fVar213;
    fVar333 = fVar390 - fVar217;
    fVar248 = pre->ray_space[k].vx.field_0.m128[0];
    fVar250 = pre->ray_space[k].vx.field_0.m128[1];
    fVar291 = pre->ray_space[k].vx.field_0.m128[2];
    fVar301 = pre->ray_space[k].vy.field_0.m128[0];
    fVar313 = pre->ray_space[k].vy.field_0.m128[1];
    fVar314 = pre->ray_space[k].vy.field_0.m128[2];
    fVar315 = pre->ray_space[k].vz.field_0.m128[0];
    fVar316 = pre->ray_space[k].vz.field_0.m128[1];
    fVar325 = pre->ray_space[k].vz.field_0.m128[2];
    fVar343 = fVar327 * fVar248 + fVar394 * fVar301 + fVar333 * fVar315;
    fVar366 = fVar327 * fVar250 + fVar394 * fVar313 + fVar333 * fVar316;
    fVar377 = fVar327 * fVar291 + fVar394 * fVar314 + fVar333 * fVar325;
    fVar327 = fVar402 - fVar210;
    fVar394 = fVar404 - fVar213;
    fVar333 = fVar405 - fVar217;
    local_398 = fVar327 * fVar248 + fVar394 * fVar301 + fVar333 * fVar315;
    local_3a8 = fVar327 * fVar250 + fVar394 * fVar313 + fVar333 * fVar316;
    fVar401 = fVar327 * fVar291 + fVar394 * fVar314 + fVar333 * fVar325;
    fVar327 = fVar357 - fVar210;
    fVar394 = fVar359 - fVar213;
    fVar333 = fVar392 - fVar217;
    local_368 = fVar327 * fVar248 + fVar394 * fVar301 + fVar333 * fVar315;
    fVar395 = fVar327 * fVar250 + fVar394 * fVar313 + fVar333 * fVar316;
    fVar327 = fVar327 * fVar291 + fVar394 * fVar314 + fVar333 * fVar325;
    fVar210 = fVar346 - fVar210;
    fVar213 = fVar348 - fVar213;
    fVar217 = fVar350 - fVar217;
    fVar248 = fVar210 * fVar248 + fVar213 * fVar301 + fVar217 * fVar315;
    fVar250 = fVar210 * fVar250 + fVar213 * fVar313 + fVar217 * fVar316;
    fVar213 = fVar210 * fVar291 + fVar213 * fVar314 + fVar217 * fVar325;
    auVar383._0_8_ = CONCAT44(fVar366,fVar343) & 0x7fffffff7fffffff;
    auVar383._8_4_ = ABS(fVar377);
    auVar383._12_4_ = ABS(fVar417);
    auVar304._0_8_ = CONCAT44(local_3a8,local_398) & 0x7fffffff7fffffff;
    auVar304._8_4_ = ABS(fVar401);
    auVar304._12_4_ = ABS(fVar406);
    auVar219 = maxps(auVar383,auVar304);
    auVar319._0_8_ = CONCAT44(fVar395,local_368) & 0x7fffffff7fffffff;
    auVar319._8_4_ = ABS(fVar327);
    auVar319._12_4_ = ABS(fVar393);
    auVar239._0_8_ = CONCAT44(fVar250,fVar248) & 0x7fffffff7fffffff;
    auVar239._8_4_ = ABS(fVar213);
    auVar239._12_4_ = ABS(fVar355);
    auVar173 = maxps(auVar319,auVar239);
    auVar173 = maxps(auVar219,auVar173);
    uVar215 = auVar173._8_8_;
    fVar210 = auVar173._4_4_;
    if (auVar173._4_4_ <= auVar173._0_4_) {
      fVar210 = auVar173._0_4_;
    }
    fVar217 = (float)iVar281;
    auVar384._8_8_ = uVar215;
    auVar384._0_8_ = uVar215;
    if (auVar173._8_4_ <= fVar210) {
      auVar385._4_12_ = auVar384._4_12_;
      auVar385._0_4_ = fVar210;
      uVar215 = auVar385._0_8_;
    }
    lVar129 = (long)iVar281 * 0x44;
    fVar291 = *(float *)(catmullrom_basis0 + lVar129 + 0x908);
    fVar301 = *(float *)(catmullrom_basis0 + lVar129 + 0x90c);
    fVar313 = *(float *)(catmullrom_basis0 + lVar129 + 0x910);
    fVar314 = *(float *)(catmullrom_basis0 + lVar129 + 0x914);
    fVar210 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar129 + 0xd8c);
    fVar315 = *(float *)(catmullrom_basis0 + lVar129 + 0xd90);
    fVar316 = *(float *)(catmullrom_basis0 + lVar129 + 0xd94);
    auVar63 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar129 + 0xd8c);
    fVar325 = *(float *)(catmullrom_basis0 + lVar129 + 0xd98);
    fVar394 = *(float *)(catmullrom_basis0 + lVar129 + 0x484);
    fVar333 = *(float *)(catmullrom_basis0 + lVar129 + 0x488);
    fVar334 = *(float *)(catmullrom_basis0 + lVar129 + 0x48c);
    fVar336 = *(float *)(catmullrom_basis0 + lVar129 + 0x490);
    fVar338 = *(float *)(catmullrom_basis0 + lVar129);
    fVar285 = *(float *)(catmullrom_basis0 + lVar129 + 4);
    fVar351 = *(float *)(catmullrom_basis0 + lVar129 + 8);
    fVar294 = *(float *)(catmullrom_basis0 + lVar129 + 0xc);
    fVar283 = fVar343 * fVar338 + local_398 * fVar394 + local_368 * fVar291 + fVar248 * fVar210;
    fVar292 = fVar343 * fVar285 + local_398 * fVar333 + local_368 * fVar301 + fVar248 * fVar315;
    fVar295 = fVar343 * fVar351 + local_398 * fVar334 + local_368 * fVar313 + fVar248 * fVar316;
    fVar298 = fVar343 * fVar294 + local_398 * fVar336 + local_368 * fVar314 + fVar248 * fVar325;
    fVar414 = fVar366 * fVar338 + local_3a8 * fVar394 + fVar395 * fVar291 + fVar250 * fVar210;
    fVar418 = fVar366 * fVar285 + local_3a8 * fVar333 + fVar395 * fVar301 + fVar250 * fVar315;
    fVar422 = fVar366 * fVar351 + local_3a8 * fVar334 + fVar395 * fVar313 + fVar250 * fVar316;
    fVar426 = fVar366 * fVar294 + local_3a8 * fVar336 + fVar395 * fVar314 + fVar250 * fVar325;
    fVar317 = fVar417 * fVar338 + fVar406 * fVar394 + fVar393 * fVar291 + fVar355 * fVar210;
    fVar326 = fVar417 * fVar285 + fVar406 * fVar333 + fVar393 * fVar301 + fVar355 * fVar315;
    auVar353._4_4_ = fVar326;
    auVar353._0_4_ = fVar317;
    fVar328 = fVar417 * fVar351 + fVar406 * fVar334 + fVar393 * fVar313 + fVar355 * fVar316;
    fVar329 = fVar417 * fVar294 + fVar406 * fVar336 + fVar393 * fVar314 + fVar355 * fVar325;
    fVar210 = *(float *)*(undefined1 (*) [12])(catmullrom_basis1 + lVar129 + 0xd8c);
    fVar315 = *(float *)(catmullrom_basis1 + lVar129 + 0xd90);
    fVar316 = *(float *)(catmullrom_basis1 + lVar129 + 0xd94);
    auVar66 = *(undefined1 (*) [12])(catmullrom_basis1 + lVar129 + 0xd8c);
    fVar356 = *(float *)(catmullrom_basis1 + lVar129 + 0xd98);
    fVar297 = *(float *)(catmullrom_basis1 + lVar129 + 0x908);
    fVar358 = *(float *)(catmullrom_basis1 + lVar129 + 0x90c);
    fVar300 = *(float *)(catmullrom_basis1 + lVar129 + 0x910);
    fVar360 = *(float *)(catmullrom_basis1 + lVar129 + 0x914);
    fVar416 = *(float *)(catmullrom_basis1 + lVar129 + 0x484);
    fVar421 = *(float *)(catmullrom_basis1 + lVar129 + 0x488);
    fVar425 = *(float *)(catmullrom_basis1 + lVar129 + 0x48c);
    fVar429 = *(float *)(catmullrom_basis1 + lVar129 + 0x490);
    fVar341 = *(float *)(catmullrom_basis1 + lVar129);
    fVar380 = *(float *)(catmullrom_basis1 + lVar129 + 4);
    fVar345 = *(float *)(catmullrom_basis1 + lVar129 + 8);
    fVar391 = *(float *)(catmullrom_basis1 + lVar129 + 0xc);
    fVar340 = fVar343 * fVar341 + local_398 * fVar416 + local_368 * fVar297 + fVar248 * fVar210;
    fVar344 = fVar343 * fVar380 + local_398 * fVar421 + local_368 * fVar358 + fVar248 * fVar315;
    fVar347 = fVar343 * fVar345 + local_398 * fVar425 + local_368 * fVar300 + fVar248 * fVar316;
    fVar349 = fVar343 * fVar391 + local_398 * fVar429 + local_368 * fVar360 + fVar248 * fVar356;
    local_378 = fVar366 * fVar341 + local_3a8 * fVar416 + fVar395 * fVar297 + fVar250 * fVar210;
    fStack_374 = fVar366 * fVar380 + local_3a8 * fVar421 + fVar395 * fVar358 + fVar250 * fVar315;
    fStack_370 = fVar366 * fVar345 + local_3a8 * fVar425 + fVar395 * fVar300 + fVar250 * fVar316;
    fStack_36c = fVar366 * fVar391 + local_3a8 * fVar429 + fVar395 * fVar360 + fVar250 * fVar356;
    auVar386._0_4_ = fVar417 * fVar341 + fVar406 * fVar416 + fVar393 * fVar297 + fVar355 * fVar210;
    auVar386._4_4_ = fVar417 * fVar380 + fVar406 * fVar421 + fVar393 * fVar358 + fVar355 * fVar315;
    auVar386._8_4_ = fVar417 * fVar345 + fVar406 * fVar425 + fVar393 * fVar300 + fVar355 * fVar316;
    auVar386._12_4_ = fVar417 * fVar391 + fVar406 * fVar429 + fVar393 * fVar360 + fVar355 * fVar356;
    fVar315 = fVar340 - fVar283;
    fVar316 = fVar344 - fVar292;
    fVar335 = fVar347 - fVar295;
    fVar337 = fVar349 - fVar298;
    local_388 = local_378 - fVar414;
    fStack_384 = fStack_374 - fVar418;
    fStack_380 = fStack_370 - fVar422;
    fStack_37c = fStack_36c - fVar426;
    fVar210 = fVar414 * fVar315 - fVar283 * local_388;
    fVar419 = fVar418 * fVar316 - fVar292 * fStack_384;
    fVar423 = fVar422 * fVar335 - fVar295 * fStack_380;
    fVar427 = fVar426 * fVar337 - fVar298 * fStack_37c;
    auVar353._8_4_ = fVar328;
    auVar353._12_4_ = fVar329;
    auVar173 = maxps(auVar353,auVar386);
    bVar100 = fVar210 * fVar210 <=
              auVar173._0_4_ * auVar173._0_4_ * (fVar315 * fVar315 + local_388 * local_388) &&
              0.0 < fVar217;
    bVar101 = fVar419 * fVar419 <=
              auVar173._4_4_ * auVar173._4_4_ * (fVar316 * fVar316 + fStack_384 * fStack_384) &&
              1.0 < fVar217;
    bVar95 = fVar423 * fVar423 <=
             auVar173._8_4_ * auVar173._8_4_ * (fVar335 * fVar335 + fStack_380 * fStack_380) &&
             2.0 < fVar217;
    bVar90 = fVar427 * fVar427 <=
             auVar173._12_4_ * auVar173._12_4_ * (fVar337 * fVar337 + fStack_37c * fStack_37c) &&
             3.0 < fVar217;
    local_468 = (float)uVar215;
    local_468 = local_468 * 4.7683716e-07;
    auVar28._4_4_ = -(uint)bVar101;
    auVar28._0_4_ = -(uint)bVar100;
    auVar28._8_4_ = -(uint)bVar95;
    auVar28._12_4_ = -(uint)bVar90;
    iVar206 = movmskps((int)(pre->ray_space + k),auVar28);
    fVar210 = *(float *)(ray + k * 4 + 0x30);
    fStack_3a4 = local_3a8;
    fStack_3a0 = local_3a8;
    fStack_39c = local_3a8;
    fStack_394 = local_398;
    fStack_390 = local_398;
    fStack_38c = local_398;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    if (iVar206 == 0) {
LAB_003cb877:
      fStack_37c = fVar294;
      fStack_380 = fVar351;
      fStack_384 = fVar285;
      local_388 = fVar338;
      bVar136 = 0;
    }
    else {
      local_518 = auVar66._0_4_;
      fStack_514 = auVar66._4_4_;
      fStack_510 = auVar66._8_4_;
      fVar146 = local_518 * fVar213 + fVar297 * fVar327 + fVar416 * fVar401 + fVar341 * fVar377;
      fVar211 = fStack_514 * fVar213 + fVar358 * fVar327 + fVar421 * fVar401 + fVar380 * fVar377;
      fVar214 = fStack_510 * fVar213 + fVar300 * fVar327 + fVar425 * fVar401 + fVar345 * fVar377;
      fVar216 = fVar356 * fVar213 + fVar360 * fVar327 + fVar429 * fVar401 + fVar391 * fVar377;
      local_4e8 = auVar63._0_4_;
      fStack_4e4 = auVar63._4_4_;
      fStack_4e0 = auVar63._8_4_;
      fVar284 = local_4e8 * fVar213 + fVar291 * fVar327 + fVar394 * fVar401 + fVar338 * fVar377;
      fVar293 = fStack_4e4 * fVar213 + fVar301 * fVar327 + fVar333 * fVar401 + fVar285 * fVar377;
      fVar296 = fStack_4e0 * fVar213 + fVar313 * fVar327 + fVar334 * fVar401 + fVar351 * fVar377;
      fVar299 = fVar325 * fVar213 + fVar314 * fVar327 + fVar336 * fVar401 + fVar294 * fVar377;
      fVar291 = *(float *)(catmullrom_basis0 + lVar129 + 0x1210);
      fVar301 = *(float *)(catmullrom_basis0 + lVar129 + 0x1214);
      fVar313 = *(float *)(catmullrom_basis0 + lVar129 + 0x1218);
      fVar314 = *(float *)(catmullrom_basis0 + lVar129 + 0x121c);
      fVar325 = *(float *)(catmullrom_basis0 + lVar129 + 0x1694);
      fVar394 = *(float *)(catmullrom_basis0 + lVar129 + 0x1698);
      fVar333 = *(float *)(catmullrom_basis0 + lVar129 + 0x169c);
      fVar334 = *(float *)(catmullrom_basis0 + lVar129 + 0x16a0);
      fVar336 = *(float *)(catmullrom_basis0 + lVar129 + 0x1b18);
      fVar338 = *(float *)(catmullrom_basis0 + lVar129 + 0x1b1c);
      fVar285 = *(float *)(catmullrom_basis0 + lVar129 + 0x1b20);
      fVar351 = *(float *)(catmullrom_basis0 + lVar129 + 0x1b24);
      fVar294 = *(float *)(catmullrom_basis0 + lVar129 + 0x1f9c);
      fVar356 = *(float *)(catmullrom_basis0 + lVar129 + 0x1fa0);
      fVar297 = *(float *)(catmullrom_basis0 + lVar129 + 0x1fa4);
      fVar358 = *(float *)(catmullrom_basis0 + lVar129 + 0x1fa8);
      fVar363 = fVar343 * fVar291 + local_398 * fVar325 + local_368 * fVar336 + fVar248 * fVar294;
      fVar367 = fVar343 * fVar301 + local_398 * fVar394 + local_368 * fVar338 + fVar248 * fVar356;
      fVar368 = fVar343 * fVar313 + local_398 * fVar333 + local_368 * fVar285 + fVar248 * fVar297;
      fVar369 = fVar343 * fVar314 + local_398 * fVar334 + local_368 * fVar351 + fVar248 * fVar358;
      fVar415 = fVar366 * fVar291 + local_3a8 * fVar325 + fVar395 * fVar336 + fVar250 * fVar294;
      fVar420 = fVar366 * fVar301 + local_3a8 * fVar394 + fVar395 * fVar338 + fVar250 * fVar356;
      fVar424 = fVar366 * fVar313 + local_3a8 * fVar333 + fVar395 * fVar285 + fVar250 * fVar297;
      fVar428 = fVar366 * fVar314 + local_3a8 * fVar334 + fVar395 * fVar351 + fVar250 * fVar358;
      fVar300 = *(float *)(catmullrom_basis1 + lVar129 + 0x1210);
      fVar360 = *(float *)(catmullrom_basis1 + lVar129 + 0x1214);
      fVar416 = *(float *)(catmullrom_basis1 + lVar129 + 0x1218);
      fVar421 = *(float *)(catmullrom_basis1 + lVar129 + 0x121c);
      fVar425 = *(float *)(catmullrom_basis1 + lVar129 + 0x1b18);
      fVar429 = *(float *)(catmullrom_basis1 + lVar129 + 0x1b1c);
      fVar341 = *(float *)(catmullrom_basis1 + lVar129 + 0x1b20);
      fVar380 = *(float *)(catmullrom_basis1 + lVar129 + 0x1b24);
      fVar345 = *(float *)(catmullrom_basis1 + lVar129 + 0x1f9c);
      fVar391 = *(float *)(catmullrom_basis1 + lVar129 + 0x1fa0);
      fVar419 = *(float *)(catmullrom_basis1 + lVar129 + 0x1fa4);
      fVar423 = *(float *)(catmullrom_basis1 + lVar129 + 0x1fa8);
      fVar427 = *(float *)(catmullrom_basis1 + lVar129 + 0x1694);
      fVar370 = *(float *)(catmullrom_basis1 + lVar129 + 0x1698);
      fVar371 = *(float *)(catmullrom_basis1 + lVar129 + 0x169c);
      fVar378 = *(float *)(catmullrom_basis1 + lVar129 + 0x16a0);
      fVar407 = fVar343 * fVar300 + local_398 * fVar427 + local_368 * fVar425 + fVar248 * fVar345;
      fVar411 = fVar343 * fVar360 + local_398 * fVar370 + local_368 * fVar429 + fVar248 * fVar391;
      fVar412 = fVar343 * fVar416 + local_398 * fVar371 + local_368 * fVar341 + fVar248 * fVar419;
      fVar413 = fVar343 * fVar421 + local_398 * fVar378 + local_368 * fVar380 + fVar248 * fVar423;
      fVar218 = fVar366 * fVar300 + local_3a8 * fVar427 + fVar395 * fVar425 + fVar250 * fVar345;
      fVar249 = fVar366 * fVar360 + local_3a8 * fVar370 + fVar395 * fVar429 + fVar250 * fVar391;
      fVar251 = fVar366 * fVar416 + local_3a8 * fVar371 + fVar395 * fVar341 + fVar250 * fVar419;
      fVar252 = fVar366 * fVar421 + local_3a8 * fVar378 + fVar395 * fVar380 + fVar250 * fVar423;
      auVar387._0_8_ = CONCAT44(fVar367,fVar363) & 0x7fffffff7fffffff;
      auVar387._8_4_ = ABS(fVar368);
      auVar387._12_4_ = ABS(fVar369);
      auVar354._0_8_ = CONCAT44(fVar420,fVar415) & 0x7fffffff7fffffff;
      auVar354._8_4_ = ABS(fVar424);
      auVar354._12_4_ = ABS(fVar428);
      auVar173 = maxps(auVar387,auVar354);
      auVar397._0_8_ =
           CONCAT44(fVar301 * fVar377 + fVar394 * fVar401 + fVar338 * fVar327 + fVar356 * fVar213,
                    fVar291 * fVar377 + fVar325 * fVar401 + fVar336 * fVar327 + fVar294 * fVar213) &
           0x7fffffff7fffffff;
      auVar397._8_4_ =
           ABS(fVar313 * fVar377 + fVar333 * fVar401 + fVar285 * fVar327 + fVar297 * fVar213);
      auVar397._12_4_ =
           ABS(fVar314 * fVar377 + fVar334 * fVar401 + fVar351 * fVar327 + fVar358 * fVar213);
      auVar173 = maxps(auVar173,auVar397);
      uVar139 = -(uint)(local_468 <= auVar173._0_4_);
      uVar140 = -(uint)(local_468 <= auVar173._4_4_);
      uVar141 = -(uint)(local_468 <= auVar173._8_4_);
      uVar142 = -(uint)(local_468 <= auVar173._12_4_);
      fVar325 = (float)((uint)fVar363 & uVar139 | ~uVar139 & (uint)fVar315);
      fVar394 = (float)((uint)fVar367 & uVar140 | ~uVar140 & (uint)fVar316);
      fVar336 = (float)((uint)fVar368 & uVar141 | ~uVar141 & (uint)fVar335);
      fVar338 = (float)((uint)fVar369 & uVar142 | ~uVar142 & (uint)fVar337);
      auVar61._4_4_ = fStack_384;
      auVar61._0_4_ = local_388;
      auVar61._8_4_ = fStack_380;
      auVar61._12_4_ = fStack_37c;
      fVar333 = (float)(~uVar139 & (uint)local_388 | (uint)fVar415 & uVar139);
      fVar334 = (float)(~uVar140 & (uint)fStack_384 | (uint)fVar420 & uVar140);
      fVar285 = (float)(~uVar141 & (uint)fStack_380 | (uint)fVar424 & uVar141);
      fVar351 = (float)(~uVar142 & (uint)fStack_37c | (uint)fVar428 & uVar142);
      auVar398._0_8_ = CONCAT44(fVar411,fVar407) & 0x7fffffff7fffffff;
      auVar398._8_4_ = ABS(fVar412);
      auVar398._12_4_ = ABS(fVar413);
      auVar362._0_8_ = CONCAT44(fVar249,fVar218) & 0x7fffffff7fffffff;
      auVar362._8_4_ = ABS(fVar251);
      auVar362._12_4_ = ABS(fVar252);
      auVar173 = maxps(auVar398,auVar362);
      auVar330._0_8_ =
           CONCAT44(fVar360 * fVar377 + fVar370 * fVar401 + fVar429 * fVar327 + fVar391 * fVar213,
                    fVar300 * fVar377 + fVar427 * fVar401 + fVar425 * fVar327 + fVar345 * fVar213) &
           0x7fffffff7fffffff;
      auVar330._8_4_ =
           ABS(fVar416 * fVar377 + fVar371 * fVar401 + fVar341 * fVar327 + fVar419 * fVar213);
      auVar330._12_4_ =
           ABS(fVar421 * fVar377 + fVar378 * fVar401 + fVar380 * fVar327 + fVar423 * fVar213);
      auVar173 = maxps(auVar173,auVar330);
      uVar139 = -(uint)(local_468 <= auVar173._0_4_);
      uVar140 = -(uint)(local_468 <= auVar173._4_4_);
      uVar141 = -(uint)(local_468 <= auVar173._8_4_);
      uVar142 = -(uint)(local_468 <= auVar173._12_4_);
      fVar297 = (float)((uint)fVar407 & uVar139 | ~uVar139 & (uint)fVar315);
      fVar358 = (float)((uint)fVar411 & uVar140 | ~uVar140 & (uint)fVar316);
      fVar300 = (float)((uint)fVar412 & uVar141 | ~uVar141 & (uint)fVar335);
      fVar360 = (float)((uint)fVar413 & uVar142 | ~uVar142 & (uint)fVar337);
      fVar315 = (float)(~uVar139 & (uint)local_388 | (uint)fVar218 & uVar139);
      fVar316 = (float)(~uVar140 & (uint)fStack_384 | (uint)fVar249 & uVar140);
      fVar294 = (float)(~uVar141 & (uint)fStack_380 | (uint)fVar251 & uVar141);
      fVar356 = (float)(~uVar142 & (uint)fStack_37c | (uint)fVar252 & uVar142);
      auVar240._0_4_ = fVar333 * fVar333 + fVar325 * fVar325;
      auVar240._4_4_ = fVar334 * fVar334 + fVar394 * fVar394;
      auVar240._8_4_ = fVar285 * fVar285 + fVar336 * fVar336;
      auVar240._12_4_ = fVar351 * fVar351 + fVar338 * fVar338;
      auVar173 = rsqrtps(auVar61,auVar240);
      fVar291 = auVar173._0_4_;
      fVar301 = auVar173._4_4_;
      fVar313 = auVar173._8_4_;
      fVar314 = auVar173._12_4_;
      auVar305._0_4_ = fVar291 * fVar291 * auVar240._0_4_ * 0.5 * fVar291;
      auVar305._4_4_ = fVar301 * fVar301 * auVar240._4_4_ * 0.5 * fVar301;
      auVar305._8_4_ = fVar313 * fVar313 * auVar240._8_4_ * 0.5 * fVar313;
      auVar305._12_4_ = fVar314 * fVar314 * auVar240._12_4_ * 0.5 * fVar314;
      fVar416 = fVar291 * 1.5 - auVar305._0_4_;
      fVar421 = fVar301 * 1.5 - auVar305._4_4_;
      fVar425 = fVar313 * 1.5 - auVar305._8_4_;
      fVar429 = fVar314 * 1.5 - auVar305._12_4_;
      auVar241._0_4_ = fVar315 * fVar315 + fVar297 * fVar297;
      auVar241._4_4_ = fVar316 * fVar316 + fVar358 * fVar358;
      auVar241._8_4_ = fVar294 * fVar294 + fVar300 * fVar300;
      auVar241._12_4_ = fVar356 * fVar356 + fVar360 * fVar360;
      auVar173 = rsqrtps(auVar305,auVar241);
      fVar291 = auVar173._0_4_;
      fVar301 = auVar173._4_4_;
      fVar313 = auVar173._8_4_;
      fVar314 = auVar173._12_4_;
      fVar291 = fVar291 * 1.5 - fVar291 * fVar291 * auVar241._0_4_ * 0.5 * fVar291;
      fVar301 = fVar301 * 1.5 - fVar301 * fVar301 * auVar241._4_4_ * 0.5 * fVar301;
      fVar313 = fVar313 * 1.5 - fVar313 * fVar313 * auVar241._8_4_ * 0.5 * fVar313;
      fVar314 = fVar314 * 1.5 - fVar314 * fVar314 * auVar241._12_4_ * 0.5 * fVar314;
      fVar380 = fVar333 * fVar416 * fVar317;
      fVar391 = fVar334 * fVar421 * fVar326;
      fVar363 = fVar285 * fVar425 * fVar328;
      fVar368 = fVar351 * fVar429 * fVar329;
      fVar333 = -fVar325 * fVar416 * fVar317;
      fVar334 = -fVar394 * fVar421 * fVar326;
      fVar336 = -fVar336 * fVar425 * fVar328;
      fVar338 = -fVar338 * fVar429 * fVar329;
      fVar415 = fVar416 * 0.0 * fVar317;
      fVar420 = fVar421 * 0.0 * fVar326;
      fVar424 = fVar425 * 0.0 * fVar328;
      fVar428 = fVar429 * 0.0 * fVar329;
      fVar407 = fVar315 * fVar291 * auVar386._0_4_;
      fVar411 = fVar316 * fVar301 * auVar386._4_4_;
      fVar412 = fVar294 * fVar313 * auVar386._8_4_;
      fVar413 = fVar356 * fVar314 * auVar386._12_4_;
      fVar419 = fVar340 + fVar407;
      fVar423 = fVar344 + fVar411;
      fVar427 = fVar347 + fVar412;
      fVar370 = fVar349 + fVar413;
      fVar416 = -fVar297 * fVar291 * auVar386._0_4_;
      fVar421 = -fVar358 * fVar301 * auVar386._4_4_;
      fVar425 = -fVar300 * fVar313 * auVar386._8_4_;
      fVar429 = -fVar360 * fVar314 * auVar386._12_4_;
      fVar371 = local_378 + fVar416;
      fVar378 = fStack_374 + fVar421;
      fVar218 = fStack_370 + fVar425;
      fVar249 = fStack_36c + fVar429;
      fVar351 = fVar291 * 0.0 * auVar386._0_4_;
      fVar356 = fVar301 * 0.0 * auVar386._4_4_;
      fVar358 = fVar313 * 0.0 * auVar386._8_4_;
      fVar360 = fVar314 * 0.0 * auVar386._12_4_;
      fVar341 = fVar283 - fVar380;
      fVar345 = fVar292 - fVar391;
      fVar335 = fVar295 - fVar363;
      fVar337 = fVar298 - fVar368;
      fVar251 = fVar146 + fVar351;
      fVar252 = fVar211 + fVar356;
      fVar367 = fVar214 + fVar358;
      fVar369 = fVar216 + fVar360;
      fVar315 = fVar414 - fVar333;
      fVar316 = fVar418 - fVar334;
      fVar325 = fVar422 - fVar336;
      fVar394 = fVar426 - fVar338;
      fVar285 = fVar284 - fVar415;
      fVar294 = fVar293 - fVar420;
      fVar297 = fVar296 - fVar424;
      fVar300 = fVar299 - fVar428;
      uVar139 = -(uint)(0.0 < (fVar315 * (fVar251 - fVar285) - fVar285 * (fVar371 - fVar315)) * 0.0
                              + (fVar285 * (fVar419 - fVar341) - (fVar251 - fVar285) * fVar341) *
                                0.0 + ((fVar371 - fVar315) * fVar341 - (fVar419 - fVar341) * fVar315
                                      ));
      uVar140 = -(uint)(0.0 < (fVar316 * (fVar252 - fVar294) - fVar294 * (fVar378 - fVar316)) * 0.0
                              + (fVar294 * (fVar423 - fVar345) - (fVar252 - fVar294) * fVar345) *
                                0.0 + ((fVar378 - fVar316) * fVar345 - (fVar423 - fVar345) * fVar316
                                      ));
      uVar141 = -(uint)(0.0 < (fVar325 * (fVar367 - fVar297) - fVar297 * (fVar218 - fVar325)) * 0.0
                              + (fVar297 * (fVar427 - fVar335) - (fVar367 - fVar297) * fVar335) *
                                0.0 + ((fVar218 - fVar325) * fVar335 - (fVar427 - fVar335) * fVar325
                                      ));
      uVar142 = -(uint)(0.0 < (fVar394 * (fVar369 - fVar300) - fVar300 * (fVar249 - fVar394)) * 0.0
                              + (fVar300 * (fVar370 - fVar337) - (fVar369 - fVar300) * fVar337) *
                                0.0 + ((fVar249 - fVar394) * fVar337 - (fVar370 - fVar337) * fVar394
                                      ));
      fVar291 = (float)((uint)(fVar340 - fVar407) & uVar139 | ~uVar139 & (uint)(fVar283 + fVar380));
      fVar301 = (float)((uint)(fVar344 - fVar411) & uVar140 | ~uVar140 & (uint)(fVar292 + fVar391));
      fVar313 = (float)((uint)(fVar347 - fVar412) & uVar141 | ~uVar141 & (uint)(fVar295 + fVar363));
      fVar314 = (float)((uint)(fVar349 - fVar413) & uVar142 | ~uVar142 & (uint)(fVar298 + fVar368));
      fVar416 = (float)((uint)(local_378 - fVar416) & uVar139 | ~uVar139 & (uint)(fVar414 + fVar333)
                       );
      fVar421 = (float)((uint)(fStack_374 - fVar421) & uVar140 |
                       ~uVar140 & (uint)(fVar418 + fVar334));
      fVar425 = (float)((uint)(fStack_370 - fVar425) & uVar141 |
                       ~uVar141 & (uint)(fVar422 + fVar336));
      fVar429 = (float)((uint)(fStack_36c - fVar429) & uVar142 |
                       ~uVar142 & (uint)(fVar426 + fVar338));
      fVar146 = (float)((uint)(fVar146 - fVar351) & uVar139 | ~uVar139 & (uint)(fVar284 + fVar415));
      fVar211 = (float)((uint)(fVar211 - fVar356) & uVar140 | ~uVar140 & (uint)(fVar293 + fVar420));
      fVar214 = (float)((uint)(fVar214 - fVar358) & uVar141 | ~uVar141 & (uint)(fVar296 + fVar424));
      fVar216 = (float)((uint)(fVar216 - fVar360) & uVar142 | ~uVar142 & (uint)(fVar299 + fVar428));
      fVar380 = (float)((uint)fVar341 & uVar139 | ~uVar139 & (uint)fVar419);
      fVar391 = (float)((uint)fVar345 & uVar140 | ~uVar140 & (uint)fVar423);
      fVar283 = (float)((uint)fVar335 & uVar141 | ~uVar141 & (uint)fVar427);
      fVar292 = (float)((uint)fVar337 & uVar142 | ~uVar142 & (uint)fVar370);
      fVar333 = (float)((uint)fVar315 & uVar139 | ~uVar139 & (uint)fVar371);
      fVar334 = (float)((uint)fVar316 & uVar140 | ~uVar140 & (uint)fVar378);
      fVar336 = (float)((uint)fVar325 & uVar141 | ~uVar141 & (uint)fVar218);
      fVar338 = (float)((uint)fVar394 & uVar142 | ~uVar142 & (uint)fVar249);
      fVar351 = (float)((uint)fVar285 & uVar139 | ~uVar139 & (uint)fVar251);
      fVar356 = (float)((uint)fVar294 & uVar140 | ~uVar140 & (uint)fVar252);
      fVar358 = (float)((uint)fVar297 & uVar141 | ~uVar141 & (uint)fVar367);
      fVar360 = (float)((uint)fVar300 & uVar142 | ~uVar142 & (uint)fVar369);
      fVar341 = (float)((uint)fVar419 & uVar139 | ~uVar139 & (uint)fVar341) - fVar291;
      fVar345 = (float)((uint)fVar423 & uVar140 | ~uVar140 & (uint)fVar345) - fVar301;
      fVar295 = (float)((uint)fVar427 & uVar141 | ~uVar141 & (uint)fVar335) - fVar313;
      fVar298 = (float)((uint)fVar370 & uVar142 | ~uVar142 & (uint)fVar337) - fVar314;
      fVar335 = (float)((uint)fVar371 & uVar139 | ~uVar139 & (uint)fVar315) - fVar416;
      fVar337 = (float)((uint)fVar378 & uVar140 | ~uVar140 & (uint)fVar316) - fVar421;
      fVar340 = (float)((uint)fVar218 & uVar141 | ~uVar141 & (uint)fVar325) - fVar425;
      fVar344 = (float)((uint)fVar249 & uVar142 | ~uVar142 & (uint)fVar394) - fVar429;
      fVar347 = (float)((uint)fVar251 & uVar139 | ~uVar139 & (uint)fVar285) - fVar146;
      fVar349 = (float)((uint)fVar252 & uVar140 | ~uVar140 & (uint)fVar294) - fVar211;
      fVar414 = (float)((uint)fVar367 & uVar141 | ~uVar141 & (uint)fVar297) - fVar214;
      fVar418 = (float)((uint)fVar369 & uVar142 | ~uVar142 & (uint)fVar300) - fVar216;
      fVar427 = fVar291 - fVar380;
      fVar370 = fVar301 - fVar391;
      fVar371 = fVar313 - fVar283;
      fVar378 = fVar314 - fVar292;
      fVar285 = fVar416 - fVar333;
      fVar294 = fVar421 - fVar334;
      fVar297 = fVar425 - fVar336;
      fVar300 = fVar429 - fVar338;
      fVar315 = fVar146 - fVar351;
      fVar316 = fVar211 - fVar356;
      fVar325 = fVar214 - fVar358;
      fVar394 = fVar216 - fVar360;
      fVar419 = (fVar416 * fVar347 - fVar146 * fVar335) * 0.0 +
                (fVar146 * fVar341 - fVar291 * fVar347) * 0.0 +
                (fVar291 * fVar335 - fVar416 * fVar341);
      fVar422 = (fVar421 * fVar349 - fVar211 * fVar337) * 0.0 +
                (fVar211 * fVar345 - fVar301 * fVar349) * 0.0 +
                (fVar301 * fVar337 - fVar421 * fVar345);
      auVar287._4_4_ = fVar422;
      auVar287._0_4_ = fVar419;
      fVar423 = (fVar425 * fVar414 - fVar214 * fVar340) * 0.0 +
                (fVar214 * fVar295 - fVar313 * fVar414) * 0.0 +
                (fVar313 * fVar340 - fVar425 * fVar295);
      fVar426 = (fVar429 * fVar418 - fVar216 * fVar344) * 0.0 +
                (fVar216 * fVar298 - fVar314 * fVar418) * 0.0 +
                (fVar314 * fVar344 - fVar429 * fVar298);
      auVar408._0_4_ =
           (fVar333 * fVar315 - fVar351 * fVar285) * 0.0 +
           (fVar351 * fVar427 - fVar380 * fVar315) * 0.0 + (fVar380 * fVar285 - fVar333 * fVar427);
      auVar408._4_4_ =
           (fVar334 * fVar316 - fVar356 * fVar294) * 0.0 +
           (fVar356 * fVar370 - fVar391 * fVar316) * 0.0 + (fVar391 * fVar294 - fVar334 * fVar370);
      auVar408._8_4_ =
           (fVar336 * fVar325 - fVar358 * fVar297) * 0.0 +
           (fVar358 * fVar371 - fVar283 * fVar325) * 0.0 + (fVar283 * fVar297 - fVar336 * fVar371);
      auVar408._12_4_ =
           (fVar338 * fVar394 - fVar360 * fVar300) * 0.0 +
           (fVar360 * fVar378 - fVar292 * fVar394) * 0.0 + (fVar292 * fVar300 - fVar338 * fVar378);
      auVar287._8_4_ = fVar423;
      auVar287._12_4_ = fVar426;
      auVar173 = maxps(auVar287,auVar408);
      bVar100 = auVar173._0_4_ <= 0.0 && bVar100;
      auVar288._0_4_ = -(uint)bVar100;
      bVar101 = auVar173._4_4_ <= 0.0 && bVar101;
      auVar288._4_4_ = -(uint)bVar101;
      bVar95 = auVar173._8_4_ <= 0.0 && bVar95;
      auVar288._8_4_ = -(uint)bVar95;
      bVar90 = auVar173._12_4_ <= 0.0 && bVar90;
      auVar288._12_4_ = -(uint)bVar90;
      iVar206 = movmskps(iVar206,auVar288);
      if (iVar206 == 0) {
LAB_003cc838:
        iVar206 = 0;
        auVar198._8_8_ = uStack_3b0;
        auVar198._0_8_ = local_3b8;
      }
      else {
        auVar306._0_4_ = fVar315 * fVar335;
        auVar306._4_4_ = fVar316 * fVar337;
        auVar306._8_4_ = fVar325 * fVar340;
        auVar306._12_4_ = fVar394 * fVar344;
        fVar351 = fVar285 * fVar347 - auVar306._0_4_;
        fVar356 = fVar294 * fVar349 - auVar306._4_4_;
        fVar358 = fVar297 * fVar414 - auVar306._8_4_;
        fVar360 = fVar300 * fVar418 - auVar306._12_4_;
        fVar315 = fVar315 * fVar341 - fVar347 * fVar427;
        fVar333 = fVar316 * fVar345 - fVar349 * fVar370;
        fVar334 = fVar325 * fVar295 - fVar414 * fVar371;
        fVar336 = fVar394 * fVar298 - fVar418 * fVar378;
        fVar285 = fVar427 * fVar335 - fVar285 * fVar341;
        fVar294 = fVar370 * fVar337 - fVar294 * fVar345;
        fVar297 = fVar371 * fVar340 - fVar297 * fVar295;
        fVar300 = fVar378 * fVar344 - fVar300 * fVar298;
        auVar320._0_4_ = fVar351 * 0.0 + fVar315 * 0.0 + fVar285;
        auVar320._4_4_ = fVar356 * 0.0 + fVar333 * 0.0 + fVar294;
        auVar320._8_4_ = fVar358 * 0.0 + fVar334 * 0.0 + fVar297;
        auVar320._12_4_ = fVar360 * 0.0 + fVar336 * 0.0 + fVar300;
        auVar173 = rcpps(auVar306,auVar320);
        fVar316 = auVar173._0_4_;
        fVar325 = auVar173._4_4_;
        fVar394 = auVar173._8_4_;
        fVar338 = auVar173._12_4_;
        fVar316 = (1.0 - auVar320._0_4_ * fVar316) * fVar316 + fVar316;
        fVar325 = (1.0 - auVar320._4_4_ * fVar325) * fVar325 + fVar325;
        fVar394 = (1.0 - auVar320._8_4_ * fVar394) * fVar394 + fVar394;
        fVar338 = (1.0 - auVar320._12_4_ * fVar338) * fVar338 + fVar338;
        fVar315 = (fVar146 * fVar285 + fVar416 * fVar315 + fVar291 * fVar351) * fVar316;
        fVar301 = (fVar211 * fVar294 + fVar421 * fVar333 + fVar301 * fVar356) * fVar325;
        fVar313 = (fVar214 * fVar297 + fVar425 * fVar334 + fVar313 * fVar358) * fVar394;
        fVar314 = (fVar216 * fVar300 + fVar429 * fVar336 + fVar314 * fVar360) * fVar338;
        fVar291 = *(float *)(ray + k * 4 + 0x80);
        bVar100 = (fVar315 <= fVar291 && fVar210 <= fVar315) && bVar100;
        auVar307._0_4_ = -(uint)bVar100;
        bVar101 = (fVar301 <= fVar291 && fVar210 <= fVar301) && bVar101;
        auVar307._4_4_ = -(uint)bVar101;
        bVar95 = (fVar313 <= fVar291 && fVar210 <= fVar313) && bVar95;
        auVar307._8_4_ = -(uint)bVar95;
        bVar90 = (fVar314 <= fVar291 && fVar210 <= fVar314) && bVar90;
        auVar307._12_4_ = -(uint)bVar90;
        iVar206 = movmskps(iVar206,auVar307);
        if (iVar206 == 0) goto LAB_003cc838;
        auVar308._0_8_ =
             CONCAT44(-(uint)(auVar320._4_4_ != 0.0 && bVar101),
                      -(uint)(auVar320._0_4_ != 0.0 && bVar100));
        auVar308._8_4_ = -(uint)(auVar320._8_4_ != 0.0 && bVar95);
        auVar308._12_4_ = -(uint)(auVar320._12_4_ != 0.0 && bVar90);
        iVar206 = movmskps(iVar206,auVar308);
        auVar198._8_8_ = uStack_3b0;
        auVar198._0_8_ = local_3b8;
        if (iVar206 != 0) {
          fVar419 = fVar419 * fVar316;
          fVar422 = fVar422 * fVar325;
          fVar423 = fVar423 * fVar394;
          fVar426 = fVar426 * fVar338;
          auVar197._0_4_ = ~uVar139 & (uint)fVar419;
          auVar197._4_4_ = ~uVar140 & (uint)fVar422;
          auVar197._8_4_ = ~uVar141 & (uint)fVar423;
          auVar197._12_4_ = ~uVar142 & (uint)fVar426;
          auVar375._0_4_ = (uint)(1.0 - fVar419) & uVar139;
          auVar375._4_4_ = (uint)(1.0 - fVar422) & uVar140;
          auVar375._8_4_ = (uint)(1.0 - fVar423) & uVar141;
          auVar375._12_4_ = (uint)(1.0 - fVar426) & uVar142;
          aVar374 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar375 | auVar197);
          local_268 = (float)(~uVar139 & (uint)(auVar408._0_4_ * fVar316) |
                             (uint)(1.0 - auVar408._0_4_ * fVar316) & uVar139);
          fStack_264 = (float)(~uVar140 & (uint)(auVar408._4_4_ * fVar325) |
                              (uint)(1.0 - auVar408._4_4_ * fVar325) & uVar140);
          fStack_260 = (float)(~uVar141 & (uint)(auVar408._8_4_ * fVar394) |
                              (uint)(1.0 - auVar408._8_4_ * fVar394) & uVar141);
          fStack_25c = (float)(~uVar142 & (uint)(auVar408._12_4_ * fVar338) |
                              (uint)(1.0 - auVar408._12_4_ * fVar338) & uVar142);
          auVar198._8_4_ = auVar308._8_4_;
          auVar198._0_8_ = auVar308._0_8_;
          auVar198._12_4_ = auVar308._12_4_;
          fVar403 = fVar315;
          fVar144 = fVar301;
          fVar145 = fVar313;
          fVar205 = fVar314;
        }
      }
      iVar206 = movmskps(iVar206,auVar198);
      fVar338 = local_388;
      fVar285 = fStack_384;
      fVar351 = fStack_380;
      fVar294 = fStack_37c;
      if (iVar206 == 0) goto LAB_003cb877;
      fVar317 = (auVar386._0_4_ - fVar317) * aVar374.v[0] + fVar317;
      fVar326 = (auVar386._4_4_ - fVar326) * aVar374.v[1] + fVar326;
      fVar328 = (auVar386._8_4_ - fVar328) * aVar374.v[2] + fVar328;
      fVar329 = (auVar386._12_4_ - fVar329) * aVar374.v[3] + fVar329;
      fVar291 = *(float *)((long)local_3d0->ray_space + k * 4 + -0x10);
      aVar242._0_4_ = -(uint)(fVar291 * (fVar317 + fVar317) < fVar403) & auVar198._0_4_;
      aVar242._4_4_ = -(uint)(fVar291 * (fVar326 + fVar326) < fVar144) & auVar198._4_4_;
      aVar242._8_4_ = -(uint)(fVar291 * (fVar328 + fVar328) < fVar145) & auVar198._8_4_;
      aVar242._12_4_ = -(uint)(fVar291 * (fVar329 + fVar329) < fVar205) & auVar198._12_4_;
      uVar139 = movmskps((int)local_3d0,(undefined1  [16])aVar242);
      if (uVar139 == 0) goto LAB_003cb877;
      local_268 = local_268 + local_268 + -1.0;
      fStack_264 = fStack_264 + fStack_264 + -1.0;
      fStack_260 = fStack_260 + fStack_260 + -1.0;
      fStack_25c = fStack_25c + fStack_25c + -1.0;
      bhit.T.field_0.v[1] = fVar144;
      bhit.T.field_0.v[0] = fVar403;
      bhit.T.field_0.v[2] = fVar145;
      bhit.T.field_0.v[3] = fVar205;
      bhit.i = 0;
      bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar339,fVar379);
      bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar417,fVar390);
      bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fVar404,fVar402);
      bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar406,fVar405);
      bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fVar359,fVar357);
      bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar393,fVar392);
      bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fVar348,fVar346);
      bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar355,fVar350);
      pRVar130 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
      bhit.U.field_0 = aVar374;
      bhit.V.field_0.v[0] = local_268;
      bhit.V.field_0.v[1] = fStack_264;
      bhit.V.field_0.v[2] = fStack_260;
      bhit.V.field_0.v[3] = fStack_25c;
      bhit.N = iVar281;
      bhit.valid.field_0 = aVar242;
      if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_003cb877;
      pRVar130 = local_3c0->args;
      if ((pRVar130->filter != (RTCFilterFunctionN)0x0) ||
         (bVar136 = 1, pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
        fVar291 = 1.0 / fVar217;
        bhit.vu.field_0.v[0] = fVar291 * (aVar374.v[0] + 0.0);
        bhit.vu.field_0.v[1] = fVar291 * (aVar374.v[1] + 1.0);
        bhit.vu.field_0.v[2] = fVar291 * (aVar374.v[2] + 2.0);
        bhit.vu.field_0.v[3] = fVar291 * (aVar374.v[3] + 3.0);
        bhit.vv.field_0._0_8_ = CONCAT44(fStack_264,local_268);
        bhit.vv.field_0._8_8_ = CONCAT44(fStack_25c,fStack_260);
        bhit.vt.field_0.v[1] = fVar144;
        bhit.vt.field_0.v[0] = fVar403;
        bhit.vt.field_0.v[2] = fVar145;
        bhit.vt.field_0.v[3] = fVar205;
        uVar131 = (ulong)(uVar139 & 0xff);
        uVar135 = 0;
        if (uVar131 != 0) {
          for (; ((uVar139 & 0xff) >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
          }
        }
        local_418 = CONCAT44((undefined4)local_3c8,(undefined4)local_3c8);
        uStack_410._0_4_ = (undefined4)local_3c8;
        uStack_410._4_4_ = (undefined4)local_3c8;
        local_438 = CONCAT44(uVar138,uVar138);
        uStack_430._0_4_ = uVar138;
        uStack_430._4_4_ = uVar138;
        local_378 = (float)*(undefined8 *)*local_350;
        fStack_374 = (float)((ulong)*(undefined8 *)*local_350 >> 0x20);
        fStack_370 = (float)*(undefined8 *)(*local_350 + 8);
        fStack_36c = (float)((ulong)*(undefined8 *)(*local_350 + 8) >> 0x20);
        while (uVar131 != 0) {
          local_f8 = bhit.vu.field_0.v[uVar135];
          uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_e8 = bhit.vv.field_0.v[uVar135];
          *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar135];
          fVar315 = 1.0 - local_f8;
          fVar291 = local_f8 * 3.0;
          fVar314 = ((fVar291 + 2.0) * (fVar315 + fVar315) + fVar315 * -3.0 * fVar315) * 0.5;
          fVar301 = (local_f8 * local_f8 + fVar315 * -2.0 * local_f8) * 0.5;
          fVar313 = (local_f8 * fVar291 + (fVar291 + -5.0) * (local_f8 + local_f8)) * 0.5;
          args.context = context->user;
          fVar291 = (local_f8 * (fVar315 + fVar315) - fVar315 * fVar315) * 0.5;
          local_128 = fVar291 * fVar379 + fVar313 * fVar402 + fVar314 * fVar357 + fVar301 * fVar346;
          local_118 = fVar291 * fVar339 + fVar313 * fVar404 + fVar314 * fVar359 + fVar301 * fVar348;
          local_108 = fVar291 * fVar390 + fVar313 * fVar405 + fVar314 * fVar392 + fVar301 * fVar350;
          fStack_124 = local_128;
          fStack_120 = local_128;
          fStack_11c = local_128;
          fStack_114 = local_118;
          fStack_110 = local_118;
          fStack_10c = local_118;
          fStack_104 = local_108;
          fStack_100 = local_108;
          fStack_fc = local_108;
          fStack_f4 = local_f8;
          fStack_f0 = local_f8;
          fStack_ec = local_f8;
          fStack_e4 = local_e8;
          fStack_e0 = local_e8;
          fStack_dc = local_e8;
          local_d8 = local_438;
          uStack_d0 = uStack_430;
          local_c8 = local_418;
          uStack_c0 = uStack_410;
          local_b8 = (args.context)->instID[0];
          uStack_b4 = local_b8;
          uStack_b0 = local_b8;
          uStack_ac = local_b8;
          local_a8 = (args.context)->instPrimID[0];
          uStack_a4 = local_a8;
          uStack_a0 = local_a8;
          uStack_9c = local_a8;
          local_3e8._4_4_ = fStack_374;
          local_3e8._0_4_ = local_378;
          local_3e8._8_4_ = fStack_370;
          local_3e8._12_4_ = fStack_36c;
          args.valid = (int *)local_3e8;
          pRVar130 = (RTCIntersectArguments *)pGVar26->userPtr;
          args.hit = (RTCHitN *)&local_128;
          args.N = 4;
          p_Var127 = pGVar26->occlusionFilterN;
          args.geometryUserPtr = pRVar130;
          args.ray = (RTCRayN *)ray;
          if (p_Var127 != (RTCFilterFunctionN)0x0) {
            p_Var127 = (RTCFilterFunctionN)(*p_Var127)(&args);
          }
          auVar243._0_4_ = -(uint)(local_3e8._0_4_ == 0);
          auVar243._4_4_ = -(uint)(local_3e8._4_4_ == 0);
          auVar243._8_4_ = -(uint)(local_3e8._8_4_ == 0);
          auVar243._12_4_ = -(uint)(local_3e8._12_4_ == 0);
          uVar139 = movmskps((int)p_Var127,auVar243);
          pRVar128 = (RTCRayN *)(ulong)(uVar139 ^ 0xf);
          if ((uVar139 ^ 0xf) == 0) {
            auVar243 = auVar243 ^ _DAT_01f46b70;
          }
          else {
            pRVar130 = context->args;
            if ((pRVar130->filter != (RTCFilterFunctionN)0x0) &&
               (((pRVar130->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
              (*pRVar130->filter)(&args);
            }
            auVar199._0_4_ = -(uint)(local_3e8._0_4_ == 0);
            auVar199._4_4_ = -(uint)(local_3e8._4_4_ == 0);
            auVar199._8_4_ = -(uint)(local_3e8._8_4_ == 0);
            auVar199._12_4_ = -(uint)(local_3e8._12_4_ == 0);
            auVar243 = auVar199 ^ _DAT_01f46b70;
            *(undefined1 (*) [16])(args.ray + 0x80) =
                 ~auVar199 & _DAT_01f45a40 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar199;
            pRVar128 = args.ray;
          }
          auVar244._0_4_ = auVar243._0_4_ << 0x1f;
          auVar244._4_4_ = auVar243._4_4_ << 0x1f;
          auVar244._8_4_ = auVar243._8_4_ << 0x1f;
          auVar244._12_4_ = auVar243._12_4_ << 0x1f;
          iVar206 = movmskps((int)pRVar128,auVar244);
          if (iVar206 != 0) {
            bVar136 = 1;
            goto LAB_003cb87f;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
          uVar131 = uVar131 ^ 1L << (uVar135 & 0x3f);
          uVar135 = 0;
          if (uVar131 != 0) {
            for (; (uVar131 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
            }
          }
        }
        bVar136 = 0;
      }
    }
LAB_003cb87f:
    uVar133 = SUB84(pRVar130,0);
    if (4 < iVar281) {
      local_68 = iVar281;
      iStack_64 = iVar281;
      iStack_60 = iVar281;
      iStack_5c = iVar281;
      local_98 = 1.0 / fVar217;
      fStack_94 = local_98;
      fStack_90 = local_98;
      fStack_8c = local_98;
      local_78 = (undefined4)local_3c8;
      uStack_74 = (undefined4)local_3c8;
      uStack_70 = (undefined4)local_3c8;
      uStack_6c = (undefined4)local_3c8;
      local_88 = uVar138;
      uStack_84 = uVar138;
      uStack_80 = uVar138;
      uStack_7c = uVar138;
      for (lVar132 = 4; uVar133 = SUB84(pRVar130,0), lVar132 < iVar281; lVar132 = lVar132 + 4) {
        uVar139 = (uint)lVar132;
        pRVar130 = (RTCIntersectArguments *)(catmullrom_basis0 + lVar129);
        pRVar7 = &pRVar130->flags + lVar132;
        fVar217 = (float)*pRVar7;
        fVar291 = (float)pRVar7[1];
        fVar301 = (float)pRVar7[2];
        fVar313 = (float)pRVar7[3];
        pfVar1 = (float *)(lVar129 + 0x22047f0 + lVar132 * 4);
        fVar314 = *pfVar1;
        fVar315 = pfVar1[1];
        fVar316 = pfVar1[2];
        fVar325 = pfVar1[3];
        pfVar1 = (float *)(lVar129 + 0x2204c74 + lVar132 * 4);
        local_388 = *pfVar1;
        fStack_384 = pfVar1[1];
        fStack_380 = pfVar1[2];
        fStack_37c = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar129 + 0x22050f8 + lVar132 * 4);
        fVar394 = *(float *)*pauVar9;
        fVar333 = *(float *)(*pauVar9 + 4);
        fVar334 = *(float *)(*pauVar9 + 8);
        auVar63 = *pauVar9;
        fVar336 = *(float *)pauVar9[1];
        local_378 = fVar343 * fVar217 +
                    local_398 * fVar314 + local_368 * local_388 + fVar248 * fVar394;
        fStack_374 = fVar343 * fVar291 +
                     fStack_394 * fVar315 + fStack_364 * fStack_384 + fVar248 * fVar333;
        fStack_370 = fVar343 * fVar301 +
                     fStack_390 * fVar316 + fStack_360 * fStack_380 + fVar248 * fVar334;
        fStack_36c = fVar343 * fVar313 +
                     fStack_38c * fVar325 + fStack_35c * fStack_37c + fVar248 * fVar336;
        fVar326 = fVar366 * fVar217 + local_3a8 * fVar314 + fVar395 * local_388 + fVar250 * fVar394;
        fVar329 = fVar366 * fVar291 +
                  fStack_3a4 * fVar315 + fVar395 * fStack_384 + fVar250 * fVar333;
        fVar292 = fVar366 * fVar301 +
                  fStack_3a0 * fVar316 + fVar395 * fStack_380 + fVar250 * fVar334;
        fVar298 = fVar366 * fVar313 +
                  fStack_39c * fVar325 + fVar395 * fStack_37c + fVar250 * fVar336;
        auVar331._0_4_ =
             fVar417 * fVar217 + fVar406 * fVar314 + fVar393 * local_388 + fVar355 * fVar394;
        auVar331._4_4_ =
             fVar417 * fVar291 + fVar406 * fVar315 + fVar393 * fStack_384 + fVar355 * fVar333;
        auVar331._8_4_ =
             fVar417 * fVar301 + fVar406 * fVar316 + fVar393 * fStack_380 + fVar355 * fVar334;
        auVar331._12_4_ =
             fVar417 * fVar313 + fVar406 * fVar325 + fVar393 * fStack_37c + fVar355 * fVar336;
        pfVar1 = (float *)(catmullrom_basis1 + lVar129 + lVar132 * 4);
        fVar394 = *pfVar1;
        fVar333 = pfVar1[1];
        fVar334 = pfVar1[2];
        fVar338 = pfVar1[3];
        pfVar1 = (float *)(lVar129 + 0x2206c10 + lVar132 * 4);
        fVar285 = *pfVar1;
        fVar351 = pfVar1[1];
        fVar294 = pfVar1[2];
        fVar356 = pfVar1[3];
        pfVar1 = (float *)(lVar129 + 0x2207094 + lVar132 * 4);
        fVar297 = *pfVar1;
        fVar358 = pfVar1[1];
        fVar300 = pfVar1[2];
        fVar360 = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar129 + 0x2207518 + lVar132 * 4);
        fVar416 = *(float *)*pauVar9;
        fVar421 = *(float *)(*pauVar9 + 4);
        fVar425 = *(float *)(*pauVar9 + 8);
        auVar66 = *pauVar9;
        fVar429 = *(float *)pauVar9[1];
        fVar380 = fVar343 * fVar394 + local_398 * fVar285 + local_368 * fVar297 + fVar248 * fVar416;
        fVar345 = fVar343 * fVar333 +
                  fStack_394 * fVar351 + fStack_364 * fVar358 + fVar248 * fVar421;
        fVar391 = fVar343 * fVar334 +
                  fStack_390 * fVar294 + fStack_360 * fVar300 + fVar248 * fVar425;
        fVar317 = fVar343 * fVar338 +
                  fStack_38c * fVar356 + fStack_35c * fVar360 + fVar248 * fVar429;
        fVar349 = fVar366 * fVar394 + local_3a8 * fVar285 + fVar395 * fVar297 + fVar250 * fVar416;
        fVar414 = fVar366 * fVar333 + fStack_3a4 * fVar351 + fVar395 * fVar358 + fVar250 * fVar421;
        fVar418 = fVar366 * fVar334 + fStack_3a0 * fVar294 + fVar395 * fVar300 + fVar250 * fVar425;
        fVar419 = fVar366 * fVar338 + fStack_39c * fVar356 + fVar395 * fVar360 + fVar250 * fVar429;
        auVar409._0_4_ =
             fVar417 * fVar394 + fVar406 * fVar285 + fVar393 * fVar297 + fVar355 * fVar416;
        auVar409._4_4_ =
             fVar417 * fVar333 + fVar406 * fVar351 + fVar393 * fVar358 + fVar355 * fVar421;
        auVar409._8_4_ =
             fVar417 * fVar334 + fVar406 * fVar294 + fVar393 * fVar300 + fVar355 * fVar425;
        auVar409._12_4_ =
             fVar417 * fVar338 + fVar406 * fVar356 + fVar393 * fVar360 + fVar355 * fVar429;
        fVar337 = fVar380 - local_378;
        fVar340 = fVar345 - fStack_374;
        fVar344 = fVar391 - fStack_370;
        fVar347 = fVar317 - fStack_36c;
        fVar416 = fVar349 - fVar326;
        fVar421 = fVar414 - fVar329;
        fVar425 = fVar418 - fVar292;
        fVar341 = fVar419 - fVar298;
        fVar328 = fVar326 * fVar337 - local_378 * fVar416;
        fVar283 = fVar329 * fVar340 - fStack_374 * fVar421;
        fVar295 = fVar292 * fVar344 - fStack_370 * fVar425;
        fVar335 = fVar298 * fVar347 - fStack_36c * fVar341;
        auVar173 = maxps(auVar331,auVar409);
        bVar100 = fVar328 * fVar328 <=
                  auVar173._0_4_ * auVar173._0_4_ * (fVar337 * fVar337 + fVar416 * fVar416) &&
                  (int)uVar139 < local_68;
        auVar342._0_4_ = -(uint)bVar100;
        bVar101 = fVar283 * fVar283 <=
                  auVar173._4_4_ * auVar173._4_4_ * (fVar340 * fVar340 + fVar421 * fVar421) &&
                  (int)(uVar139 | 1) < iStack_64;
        auVar342._4_4_ = -(uint)bVar101;
        bVar95 = fVar295 * fVar295 <=
                 auVar173._8_4_ * auVar173._8_4_ * (fVar344 * fVar344 + fVar425 * fVar425) &&
                 (int)(uVar139 | 2) < iStack_60;
        auVar342._8_4_ = -(uint)bVar95;
        bVar90 = fVar335 * fVar335 <=
                 auVar173._12_4_ * auVar173._12_4_ * (fVar347 * fVar347 + fVar341 * fVar341) &&
                 (int)(uVar139 | 3) < iStack_5c;
        auVar342._12_4_ = -(uint)bVar90;
        uVar138 = movmskps((int)uVar131,auVar342);
        uVar131 = (ulong)uVar138;
        if (uVar138 != 0) {
          local_58 = fVar337;
          fStack_54 = fVar340;
          fStack_50 = fVar344;
          fStack_4c = fVar347;
          local_518 = auVar66._0_4_;
          fStack_514 = auVar66._4_4_;
          fStack_510 = auVar66._8_4_;
          fVar378 = local_518 * fVar213 + fVar297 * fVar327 + fVar285 * fVar401 + fVar394 * fVar377;
          fVar146 = fStack_514 * fVar213 + fVar358 * fVar327 + fVar351 * fVar401 + fVar333 * fVar377
          ;
          fVar211 = fStack_510 * fVar213 + fVar300 * fVar327 + fVar294 * fVar401 + fVar334 * fVar377
          ;
          fVar214 = fVar429 * fVar213 + fVar360 * fVar327 + fVar356 * fVar401 + fVar338 * fVar377;
          local_4e8 = auVar63._0_4_;
          fStack_4e4 = auVar63._4_4_;
          fStack_4e0 = auVar63._8_4_;
          fVar299 = local_4e8 * fVar213 + local_388 * fVar327 + fVar314 * fVar401 +
                    fVar217 * fVar377;
          fVar363 = fStack_4e4 * fVar213 + fStack_384 * fVar327 + fVar315 * fVar401 +
                    fVar291 * fVar377;
          fVar367 = fStack_4e0 * fVar213 + fStack_380 * fVar327 + fVar316 * fVar401 +
                    fVar301 * fVar377;
          fVar368 = fVar336 * fVar213 + fStack_37c * fVar327 + fVar325 * fVar401 + fVar313 * fVar377
          ;
          pfVar1 = (float *)(lVar129 + 0x220557c + lVar132 * 4);
          fVar217 = *pfVar1;
          fVar291 = pfVar1[1];
          fVar301 = pfVar1[2];
          fVar313 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2205a00 + lVar132 * 4);
          fVar314 = *pfVar1;
          fVar315 = pfVar1[1];
          fVar316 = pfVar1[2];
          fVar325 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2205e84 + lVar132 * 4);
          fVar394 = *pfVar1;
          fVar333 = pfVar1[1];
          fVar334 = pfVar1[2];
          fVar336 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2206308 + lVar132 * 4);
          fVar338 = *pfVar1;
          fVar285 = pfVar1[1];
          fVar351 = pfVar1[2];
          fVar294 = pfVar1[3];
          fVar369 = fVar343 * fVar217 +
                    local_398 * fVar314 + local_368 * fVar394 + fVar248 * fVar338;
          fVar407 = fVar343 * fVar291 +
                    fStack_394 * fVar315 + fStack_364 * fVar333 + fVar248 * fVar285;
          fVar411 = fVar343 * fVar301 +
                    fStack_390 * fVar316 + fStack_360 * fVar334 + fVar248 * fVar351;
          fVar412 = fVar343 * fVar313 +
                    fStack_38c * fVar325 + fStack_35c * fVar336 + fVar248 * fVar294;
          fVar216 = fVar366 * fVar217 + local_3a8 * fVar314 + fVar395 * fVar394 + fVar250 * fVar338;
          fVar218 = fVar366 * fVar291 + fStack_3a4 * fVar315 + fVar395 * fVar333 + fVar250 * fVar285
          ;
          fVar249 = fVar366 * fVar301 + fStack_3a0 * fVar316 + fVar395 * fVar334 + fVar250 * fVar351
          ;
          fVar251 = fVar366 * fVar313 + fStack_39c * fVar325 + fVar395 * fVar336 + fVar250 * fVar294
          ;
          pfVar1 = (float *)(lVar129 + 0x220799c + lVar132 * 4);
          fVar356 = *pfVar1;
          fVar297 = pfVar1[1];
          fVar358 = pfVar1[2];
          fVar300 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x22082a4 + lVar132 * 4);
          fVar360 = *pfVar1;
          fVar429 = pfVar1[1];
          fVar328 = pfVar1[2];
          fVar283 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2208728 + lVar132 * 4);
          fVar295 = *pfVar1;
          fVar335 = pfVar1[1];
          fVar422 = pfVar1[2];
          fVar423 = pfVar1[3];
          pfVar1 = (float *)(lVar129 + 0x2207e20 + lVar132 * 4);
          fVar426 = *pfVar1;
          fVar427 = pfVar1[1];
          fVar370 = pfVar1[2];
          fVar371 = pfVar1[3];
          fVar413 = fVar343 * fVar356 +
                    local_398 * fVar426 + local_368 * fVar360 + fVar248 * fVar295;
          fVar415 = fVar343 * fVar297 +
                    fStack_394 * fVar427 + fStack_364 * fVar429 + fVar248 * fVar335;
          fVar420 = fVar343 * fVar358 +
                    fStack_390 * fVar370 + fStack_360 * fVar328 + fVar248 * fVar422;
          fVar424 = fVar343 * fVar300 +
                    fStack_38c * fVar371 + fStack_35c * fVar283 + fVar248 * fVar423;
          fVar252 = fVar366 * fVar356 + local_3a8 * fVar426 + fVar395 * fVar360 + fVar250 * fVar295;
          fVar284 = fVar366 * fVar297 + fStack_3a4 * fVar427 + fVar395 * fVar429 + fVar250 * fVar335
          ;
          fVar293 = fVar366 * fVar358 + fStack_3a0 * fVar370 + fVar395 * fVar328 + fVar250 * fVar422
          ;
          fVar296 = fVar366 * fVar300 + fStack_39c * fVar371 + fVar395 * fVar283 + fVar250 * fVar423
          ;
          auVar388._0_8_ = CONCAT44(fVar407,fVar369) & 0x7fffffff7fffffff;
          auVar388._8_4_ = ABS(fVar411);
          auVar388._12_4_ = ABS(fVar412);
          auVar321._0_8_ = CONCAT44(fVar218,fVar216) & 0x7fffffff7fffffff;
          auVar321._8_4_ = ABS(fVar249);
          auVar321._12_4_ = ABS(fVar251);
          auVar173 = maxps(auVar388,auVar321);
          auVar399._0_8_ =
               CONCAT44(fVar291 * fVar377 +
                        fVar315 * fVar401 + fVar333 * fVar327 + fVar285 * fVar213,
                        fVar217 * fVar377 +
                        fVar314 * fVar401 + fVar394 * fVar327 + fVar338 * fVar213) &
               0x7fffffff7fffffff;
          auVar399._8_4_ =
               ABS(fVar301 * fVar377 + fVar316 * fVar401 + fVar334 * fVar327 + fVar351 * fVar213);
          auVar399._12_4_ =
               ABS(fVar313 * fVar377 + fVar325 * fVar401 + fVar336 * fVar327 + fVar294 * fVar213);
          auVar173 = maxps(auVar173,auVar399);
          uVar138 = -(uint)(local_468 <= auVar173._0_4_);
          uVar140 = -(uint)(local_468 <= auVar173._4_4_);
          uVar141 = -(uint)(local_468 <= auVar173._8_4_);
          uVar142 = -(uint)(local_468 <= auVar173._12_4_);
          auVar322._0_4_ = ~uVar138 & (uint)fVar337;
          auVar322._4_4_ = ~uVar140 & (uint)fVar340;
          auVar322._8_4_ = ~uVar141 & (uint)fVar344;
          auVar322._12_4_ = ~uVar142 & (uint)fVar347;
          auVar376._0_4_ = (uint)fVar369 & uVar138;
          auVar376._4_4_ = (uint)fVar407 & uVar140;
          auVar376._8_4_ = (uint)fVar411 & uVar141;
          auVar376._12_4_ = (uint)fVar412 & uVar142;
          auVar376 = auVar376 | auVar322;
          fVar333 = (float)(~uVar138 & (uint)fVar416 | (uint)fVar216 & uVar138);
          fVar336 = (float)(~uVar140 & (uint)fVar421 | (uint)fVar218 & uVar140);
          fVar216 = (float)(~uVar141 & (uint)fVar425 | (uint)fVar249 & uVar141);
          fVar218 = (float)(~uVar142 & (uint)fVar341 | (uint)fVar251 & uVar142);
          auVar400._0_8_ = CONCAT44(fVar415,fVar413) & 0x7fffffff7fffffff;
          auVar400._8_4_ = ABS(fVar420);
          auVar400._12_4_ = ABS(fVar424);
          auVar276._0_8_ = CONCAT44(fVar284,fVar252) & 0x7fffffff7fffffff;
          auVar276._8_4_ = ABS(fVar293);
          auVar276._12_4_ = ABS(fVar296);
          auVar173 = maxps(auVar400,auVar276);
          auVar200._0_8_ =
               CONCAT44(fVar297 * fVar377 +
                        fVar427 * fVar401 + fVar429 * fVar327 + fVar335 * fVar213,
                        fVar356 * fVar377 +
                        fVar426 * fVar401 + fVar360 * fVar327 + fVar295 * fVar213) &
               0x7fffffff7fffffff;
          auVar200._8_4_ =
               ABS(fVar358 * fVar377 + fVar370 * fVar401 + fVar328 * fVar327 + fVar422 * fVar213);
          auVar200._12_4_ =
               ABS(fVar300 * fVar377 + fVar371 * fVar401 + fVar283 * fVar327 + fVar423 * fVar213);
          auVar173 = maxps(auVar173,auVar200);
          uVar138 = -(uint)(local_468 <= auVar173._0_4_);
          uVar140 = -(uint)(local_468 <= auVar173._4_4_);
          uVar141 = -(uint)(local_468 <= auVar173._8_4_);
          uVar142 = -(uint)(local_468 <= auVar173._12_4_);
          fVar360 = (float)((uint)fVar413 & uVar138 | ~uVar138 & (uint)fVar337);
          fVar429 = (float)((uint)fVar415 & uVar140 | ~uVar140 & (uint)fVar340);
          fVar328 = (float)((uint)fVar420 & uVar141 | ~uVar141 & (uint)fVar344);
          fVar344 = (float)((uint)fVar424 & uVar142 | ~uVar142 & (uint)fVar347);
          fVar356 = (float)(~uVar138 & (uint)fVar416 | (uint)fVar252 & uVar138);
          fVar297 = (float)(~uVar140 & (uint)fVar421 | (uint)fVar284 & uVar140);
          fVar358 = (float)(~uVar141 & (uint)fVar425 | (uint)fVar293 & uVar141);
          fVar300 = (float)(~uVar142 & (uint)fVar341 | (uint)fVar296 & uVar142);
          fVar325 = auVar376._0_4_;
          fVar217 = auVar376._4_4_;
          fVar291 = auVar376._8_4_;
          fVar301 = auVar376._12_4_;
          auVar309._0_4_ = fVar333 * fVar333 + fVar325 * fVar325;
          auVar309._4_4_ = fVar336 * fVar336 + fVar217 * fVar217;
          auVar309._8_4_ = fVar216 * fVar216 + fVar291 * fVar291;
          auVar309._12_4_ = fVar218 * fVar218 + fVar301 * fVar301;
          auVar173 = rsqrtps(auVar322,auVar309);
          fVar313 = auVar173._0_4_;
          fVar314 = auVar173._4_4_;
          fVar315 = auVar173._8_4_;
          fVar316 = auVar173._12_4_;
          auVar323._0_4_ = fVar313 * fVar313 * auVar309._0_4_ * 0.5 * fVar313;
          auVar323._4_4_ = fVar314 * fVar314 * auVar309._4_4_ * 0.5 * fVar314;
          auVar323._8_4_ = fVar315 * fVar315 * auVar309._8_4_ * 0.5 * fVar315;
          auVar323._12_4_ = fVar316 * fVar316 * auVar309._12_4_ * 0.5 * fVar316;
          fVar338 = fVar313 * 1.5 - auVar323._0_4_;
          fVar285 = fVar314 * 1.5 - auVar323._4_4_;
          fVar351 = fVar315 * 1.5 - auVar323._8_4_;
          fVar294 = fVar316 * 1.5 - auVar323._12_4_;
          auVar310._0_4_ = fVar356 * fVar356 + fVar360 * fVar360;
          auVar310._4_4_ = fVar297 * fVar297 + fVar429 * fVar429;
          auVar310._8_4_ = fVar358 * fVar358 + fVar328 * fVar328;
          auVar310._12_4_ = fVar300 * fVar300 + fVar344 * fVar344;
          auVar173 = rsqrtps(auVar323,auVar310);
          fVar313 = auVar173._0_4_;
          fVar314 = auVar173._4_4_;
          fVar315 = auVar173._8_4_;
          fVar316 = auVar173._12_4_;
          fVar394 = fVar313 * 1.5 - fVar313 * fVar313 * auVar310._0_4_ * 0.5 * fVar313;
          fVar314 = fVar314 * 1.5 - fVar314 * fVar314 * auVar310._4_4_ * 0.5 * fVar314;
          fVar334 = fVar315 * 1.5 - fVar315 * fVar315 * auVar310._8_4_ * 0.5 * fVar315;
          fVar316 = fVar316 * 1.5 - fVar316 * fVar316 * auVar310._12_4_ * 0.5 * fVar316;
          fVar426 = fVar333 * fVar338 * auVar331._0_4_;
          fVar370 = fVar336 * fVar285 * auVar331._4_4_;
          fVar216 = fVar216 * fVar351 * auVar331._8_4_;
          fVar249 = fVar218 * fVar294 * auVar331._12_4_;
          fVar315 = -fVar325 * fVar338 * auVar331._0_4_;
          fVar325 = -fVar217 * fVar285 * auVar331._4_4_;
          fVar333 = -fVar291 * fVar351 * auVar331._8_4_;
          fVar336 = -fVar301 * fVar294 * auVar331._12_4_;
          fVar416 = fVar338 * 0.0 * auVar331._0_4_;
          fVar425 = fVar285 * 0.0 * auVar331._4_4_;
          fVar341 = fVar351 * 0.0 * auVar331._8_4_;
          fVar340 = fVar294 * 0.0 * auVar331._12_4_;
          fVar252 = fVar356 * fVar394 * auVar409._0_4_;
          fVar284 = fVar297 * fVar314 * auVar409._4_4_;
          fVar293 = fVar358 * fVar334 * auVar409._8_4_;
          fVar296 = fVar300 * fVar316 * auVar409._12_4_;
          fVar283 = fVar380 + fVar252;
          fVar295 = fVar345 + fVar284;
          fVar335 = fVar391 + fVar293;
          fVar337 = fVar317 + fVar296;
          fVar217 = -fVar360 * fVar394 * auVar409._0_4_;
          fVar291 = -fVar429 * fVar314 * auVar409._4_4_;
          fVar301 = -fVar328 * fVar334 * auVar409._8_4_;
          fVar313 = -fVar344 * fVar316 * auVar409._12_4_;
          fVar344 = fVar349 + fVar217;
          fVar347 = fVar414 + fVar291;
          fVar422 = fVar418 + fVar301;
          fVar423 = fVar419 + fVar313;
          fVar285 = fVar394 * 0.0 * auVar409._0_4_;
          fVar294 = fVar314 * 0.0 * auVar409._4_4_;
          fVar297 = fVar334 * 0.0 * auVar409._8_4_;
          fVar300 = fVar316 * 0.0 * auVar409._12_4_;
          fVar314 = local_378 - fVar426;
          fVar316 = fStack_374 - fVar370;
          fVar394 = fStack_370 - fVar216;
          fVar334 = fStack_36c - fVar249;
          fVar427 = fVar378 + fVar285;
          fVar371 = fVar146 + fVar294;
          fVar218 = fVar211 + fVar297;
          fVar251 = fVar214 + fVar300;
          fVar338 = fVar326 - fVar315;
          fVar351 = fVar329 - fVar325;
          fVar356 = fVar292 - fVar333;
          fVar358 = fVar298 - fVar336;
          fVar360 = fVar299 - fVar416;
          fVar421 = fVar363 - fVar425;
          fVar429 = fVar367 - fVar341;
          fVar328 = fVar368 - fVar340;
          uVar138 = -(uint)(0.0 < (fVar338 * (fVar427 - fVar360) - fVar360 * (fVar344 - fVar338)) *
                                  0.0 + (fVar360 * (fVar283 - fVar314) -
                                        (fVar427 - fVar360) * fVar314) * 0.0 +
                                        ((fVar344 - fVar338) * fVar314 -
                                        (fVar283 - fVar314) * fVar338));
          uVar140 = -(uint)(0.0 < (fVar351 * (fVar371 - fVar421) - fVar421 * (fVar347 - fVar351)) *
                                  0.0 + (fVar421 * (fVar295 - fVar316) -
                                        (fVar371 - fVar421) * fVar316) * 0.0 +
                                        ((fVar347 - fVar351) * fVar316 -
                                        (fVar295 - fVar316) * fVar351));
          uVar141 = -(uint)(0.0 < (fVar356 * (fVar218 - fVar429) - fVar429 * (fVar422 - fVar356)) *
                                  0.0 + (fVar429 * (fVar335 - fVar394) -
                                        (fVar218 - fVar429) * fVar394) * 0.0 +
                                        ((fVar422 - fVar356) * fVar394 -
                                        (fVar335 - fVar394) * fVar356));
          uVar142 = -(uint)(0.0 < (fVar358 * (fVar251 - fVar328) - fVar328 * (fVar423 - fVar358)) *
                                  0.0 + (fVar328 * (fVar337 - fVar334) -
                                        (fVar251 - fVar328) * fVar334) * 0.0 +
                                        ((fVar423 - fVar358) * fVar334 -
                                        (fVar337 - fVar334) * fVar358));
          fVar426 = (float)((uint)(fVar380 - fVar252) & uVar138 |
                           ~uVar138 & (uint)(local_378 + fVar426));
          fVar370 = (float)((uint)(fVar345 - fVar284) & uVar140 |
                           ~uVar140 & (uint)(fStack_374 + fVar370));
          fVar216 = (float)((uint)(fVar391 - fVar293) & uVar141 |
                           ~uVar141 & (uint)(fStack_370 + fVar216));
          fVar249 = (float)((uint)(fVar317 - fVar296) & uVar142 |
                           ~uVar142 & (uint)(fStack_36c + fVar249));
          fVar349 = (float)((uint)(fVar349 - fVar217) & uVar138 |
                           ~uVar138 & (uint)(fVar326 + fVar315));
          fVar414 = (float)((uint)(fVar414 - fVar291) & uVar140 |
                           ~uVar140 & (uint)(fVar329 + fVar325));
          fVar418 = (float)((uint)(fVar418 - fVar301) & uVar141 |
                           ~uVar141 & (uint)(fVar292 + fVar333));
          fVar419 = (float)((uint)(fVar419 - fVar313) & uVar142 |
                           ~uVar142 & (uint)(fVar298 + fVar336));
          fVar329 = (float)((uint)(fVar378 - fVar285) & uVar138 |
                           ~uVar138 & (uint)(fVar299 + fVar416));
          fVar292 = (float)((uint)(fVar146 - fVar294) & uVar140 |
                           ~uVar140 & (uint)(fVar363 + fVar425));
          fVar298 = (float)((uint)(fVar211 - fVar297) & uVar141 |
                           ~uVar141 & (uint)(fVar367 + fVar341));
          fVar340 = (float)((uint)(fVar214 - fVar300) & uVar142 |
                           ~uVar142 & (uint)(fVar368 + fVar340));
          fVar315 = (float)((uint)fVar314 & uVar138 | ~uVar138 & (uint)fVar283);
          fVar325 = (float)((uint)fVar316 & uVar140 | ~uVar140 & (uint)fVar295);
          fVar333 = (float)((uint)fVar394 & uVar141 | ~uVar141 & (uint)fVar335);
          fVar336 = (float)((uint)fVar334 & uVar142 | ~uVar142 & (uint)fVar337);
          fVar285 = (float)((uint)fVar338 & uVar138 | ~uVar138 & (uint)fVar344);
          fVar294 = (float)((uint)fVar351 & uVar140 | ~uVar140 & (uint)fVar347);
          fVar297 = (float)((uint)fVar356 & uVar141 | ~uVar141 & (uint)fVar422);
          fVar300 = (float)((uint)fVar358 & uVar142 | ~uVar142 & (uint)fVar423);
          fVar416 = (float)((uint)fVar360 & uVar138 | ~uVar138 & (uint)fVar427);
          fVar425 = (float)((uint)fVar421 & uVar140 | ~uVar140 & (uint)fVar371);
          fVar341 = (float)((uint)fVar429 & uVar141 | ~uVar141 & (uint)fVar218);
          fVar380 = (float)((uint)fVar328 & uVar142 | ~uVar142 & (uint)fVar251);
          fVar345 = (float)((uint)fVar283 & uVar138 | ~uVar138 & (uint)fVar314) - fVar426;
          fVar391 = (float)((uint)fVar295 & uVar140 | ~uVar140 & (uint)fVar316) - fVar370;
          fVar317 = (float)((uint)fVar335 & uVar141 | ~uVar141 & (uint)fVar394) - fVar216;
          fVar326 = (float)((uint)fVar337 & uVar142 | ~uVar142 & (uint)fVar334) - fVar249;
          fVar338 = (float)((uint)fVar344 & uVar138 | ~uVar138 & (uint)fVar338) - fVar349;
          fVar351 = (float)((uint)fVar347 & uVar140 | ~uVar140 & (uint)fVar351) - fVar414;
          fVar356 = (float)((uint)fVar422 & uVar141 | ~uVar141 & (uint)fVar356) - fVar418;
          fVar358 = (float)((uint)fVar423 & uVar142 | ~uVar142 & (uint)fVar358) - fVar419;
          fVar360 = (float)((uint)fVar427 & uVar138 | ~uVar138 & (uint)fVar360) - fVar329;
          fVar421 = (float)((uint)fVar371 & uVar140 | ~uVar140 & (uint)fVar421) - fVar292;
          fVar429 = (float)((uint)fVar218 & uVar141 | ~uVar141 & (uint)fVar429) - fVar298;
          fVar328 = (float)((uint)fVar251 & uVar142 | ~uVar142 & (uint)fVar328) - fVar340;
          fVar344 = fVar426 - fVar315;
          fVar347 = fVar370 - fVar325;
          fVar422 = fVar216 - fVar333;
          fVar423 = fVar249 - fVar336;
          fVar217 = fVar349 - fVar285;
          fVar291 = fVar414 - fVar294;
          fVar301 = fVar418 - fVar297;
          fVar313 = fVar419 - fVar300;
          fVar314 = fVar329 - fVar416;
          fVar316 = fVar292 - fVar425;
          fVar394 = fVar298 - fVar341;
          fVar334 = fVar340 - fVar380;
          fVar283 = (fVar349 * fVar360 - fVar329 * fVar338) * 0.0 +
                    (fVar329 * fVar345 - fVar426 * fVar360) * 0.0 +
                    (fVar426 * fVar338 - fVar349 * fVar345);
          fVar295 = (fVar414 * fVar421 - fVar292 * fVar351) * 0.0 +
                    (fVar292 * fVar391 - fVar370 * fVar421) * 0.0 +
                    (fVar370 * fVar351 - fVar414 * fVar391);
          auVar289._4_4_ = fVar295;
          auVar289._0_4_ = fVar283;
          fVar335 = (fVar418 * fVar429 - fVar298 * fVar356) * 0.0 +
                    (fVar298 * fVar317 - fVar216 * fVar429) * 0.0 +
                    (fVar216 * fVar356 - fVar418 * fVar317);
          fVar337 = (fVar419 * fVar328 - fVar340 * fVar358) * 0.0 +
                    (fVar340 * fVar326 - fVar249 * fVar328) * 0.0 +
                    (fVar249 * fVar358 - fVar419 * fVar326);
          auVar410._0_4_ =
               (fVar285 * fVar314 - fVar416 * fVar217) * 0.0 +
               (fVar416 * fVar344 - fVar315 * fVar314) * 0.0 +
               (fVar315 * fVar217 - fVar285 * fVar344);
          auVar410._4_4_ =
               (fVar294 * fVar316 - fVar425 * fVar291) * 0.0 +
               (fVar425 * fVar347 - fVar325 * fVar316) * 0.0 +
               (fVar325 * fVar291 - fVar294 * fVar347);
          auVar410._8_4_ =
               (fVar297 * fVar394 - fVar341 * fVar301) * 0.0 +
               (fVar341 * fVar422 - fVar333 * fVar394) * 0.0 +
               (fVar333 * fVar301 - fVar297 * fVar422);
          auVar410._12_4_ =
               (fVar300 * fVar334 - fVar380 * fVar313) * 0.0 +
               (fVar380 * fVar423 - fVar336 * fVar334) * 0.0 +
               (fVar336 * fVar313 - fVar300 * fVar423);
          auVar289._8_4_ = fVar335;
          auVar289._12_4_ = fVar337;
          auVar173 = maxps(auVar289,auVar410);
          bVar100 = auVar173._0_4_ <= 0.0 && bVar100;
          auVar290._0_4_ = -(uint)bVar100;
          bVar101 = auVar173._4_4_ <= 0.0 && bVar101;
          auVar290._4_4_ = -(uint)bVar101;
          bVar95 = auVar173._8_4_ <= 0.0 && bVar95;
          auVar290._8_4_ = -(uint)bVar95;
          bVar90 = auVar173._12_4_ <= 0.0 && bVar90;
          auVar290._12_4_ = -(uint)bVar90;
          iVar206 = movmskps((int)(catmullrom_basis1 + lVar129),auVar290);
          if (iVar206 == 0) {
LAB_003cc786:
            auVar278._8_8_ = uStack_3b0;
            auVar278._0_8_ = local_3b8;
          }
          else {
            fVar333 = fVar217 * fVar360 - fVar314 * fVar338;
            fVar336 = fVar291 * fVar421 - fVar316 * fVar351;
            fVar285 = fVar301 * fVar429 - fVar394 * fVar356;
            fVar294 = fVar313 * fVar328 - fVar334 * fVar358;
            fVar315 = fVar314 * fVar345 - fVar360 * fVar344;
            fVar316 = fVar316 * fVar391 - fVar421 * fVar347;
            fVar325 = fVar394 * fVar317 - fVar429 * fVar422;
            fVar394 = fVar334 * fVar326 - fVar328 * fVar423;
            fVar217 = fVar344 * fVar338 - fVar217 * fVar345;
            fVar334 = fVar347 * fVar351 - fVar291 * fVar391;
            fVar338 = fVar422 * fVar356 - fVar301 * fVar317;
            fVar351 = fVar423 * fVar358 - fVar313 * fVar326;
            auVar277._0_4_ = fVar315 * 0.0 + fVar217;
            auVar277._4_4_ = fVar316 * 0.0 + fVar334;
            auVar277._8_4_ = fVar325 * 0.0 + fVar338;
            auVar277._12_4_ = fVar394 * 0.0 + fVar351;
            auVar332._0_4_ = fVar333 * 0.0 + auVar277._0_4_;
            auVar332._4_4_ = fVar336 * 0.0 + auVar277._4_4_;
            auVar332._8_4_ = fVar285 * 0.0 + auVar277._8_4_;
            auVar332._12_4_ = fVar294 * 0.0 + auVar277._12_4_;
            auVar173 = rcpps(auVar277,auVar332);
            fVar291 = auVar173._0_4_;
            fVar301 = auVar173._4_4_;
            fVar313 = auVar173._8_4_;
            fVar314 = auVar173._12_4_;
            fVar291 = (1.0 - auVar332._0_4_ * fVar291) * fVar291 + fVar291;
            fVar301 = (1.0 - auVar332._4_4_ * fVar301) * fVar301 + fVar301;
            fVar313 = (1.0 - auVar332._8_4_ * fVar313) * fVar313 + fVar313;
            fVar314 = (1.0 - auVar332._12_4_ * fVar314) * fVar314 + fVar314;
            fVar315 = (fVar329 * fVar217 + fVar349 * fVar315 + fVar426 * fVar333) * fVar291;
            fVar316 = (fVar292 * fVar334 + fVar414 * fVar316 + fVar370 * fVar336) * fVar301;
            aVar389.v[1] = fVar316;
            aVar389.v[0] = fVar315;
            fVar325 = (fVar298 * fVar338 + fVar418 * fVar325 + fVar216 * fVar285) * fVar313;
            fVar394 = (fVar340 * fVar351 + fVar419 * fVar394 + fVar249 * fVar294) * fVar314;
            fVar217 = *(float *)(ray + k * 4 + 0x80);
            bVar100 = (fVar210 <= fVar315 && fVar315 <= fVar217) && bVar100;
            auVar311._0_4_ = -(uint)bVar100;
            bVar101 = (fVar210 <= fVar316 && fVar316 <= fVar217) && bVar101;
            auVar311._4_4_ = -(uint)bVar101;
            bVar95 = (fVar210 <= fVar325 && fVar325 <= fVar217) && bVar95;
            auVar311._8_4_ = -(uint)bVar95;
            bVar90 = (fVar210 <= fVar394 && fVar394 <= fVar217) && bVar90;
            auVar311._12_4_ = -(uint)bVar90;
            iVar206 = movmskps(iVar206,auVar311);
            if (iVar206 == 0) goto LAB_003cc786;
            auVar312._0_8_ =
                 CONCAT44(-(uint)(auVar332._4_4_ != 0.0 && bVar101),
                          -(uint)(auVar332._0_4_ != 0.0 && bVar100));
            auVar312._8_4_ = -(uint)(auVar332._8_4_ != 0.0 && bVar95);
            auVar312._12_4_ = -(uint)(auVar332._12_4_ != 0.0 && bVar90);
            iVar206 = movmskps(iVar206,auVar312);
            auVar278._8_8_ = uStack_3b0;
            auVar278._0_8_ = local_3b8;
            if (iVar206 != 0) {
              fVar283 = fVar283 * fVar291;
              fVar295 = fVar295 * fVar301;
              fVar335 = fVar335 * fVar313;
              fVar337 = fVar337 * fVar314;
              auVar201._0_4_ = ~uVar138 & (uint)fVar283;
              auVar201._4_4_ = ~uVar140 & (uint)fVar295;
              auVar201._8_4_ = ~uVar141 & (uint)fVar335;
              auVar201._12_4_ = ~uVar142 & (uint)fVar337;
              auVar364._0_4_ = (uint)(1.0 - fVar283) & uVar138;
              auVar364._4_4_ = (uint)(1.0 - fVar295) & uVar140;
              auVar364._8_4_ = (uint)(1.0 - fVar335) & uVar141;
              auVar364._12_4_ = (uint)(1.0 - fVar337) & uVar142;
              aVar365 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar364 | auVar201);
              local_278 = (float)(~uVar138 & (uint)(auVar410._0_4_ * fVar291) |
                                 (uint)(1.0 - auVar410._0_4_ * fVar291) & uVar138);
              fStack_274 = (float)(~uVar140 & (uint)(auVar410._4_4_ * fVar301) |
                                  (uint)(1.0 - auVar410._4_4_ * fVar301) & uVar140);
              fStack_270 = (float)(~uVar141 & (uint)(auVar410._8_4_ * fVar313) |
                                  (uint)(1.0 - auVar410._8_4_ * fVar313) & uVar141);
              fStack_26c = (float)(~uVar142 & (uint)(auVar410._12_4_ * fVar314) |
                                  (uint)(1.0 - auVar410._12_4_ * fVar314) & uVar142);
              auVar278._8_4_ = auVar312._8_4_;
              auVar278._0_8_ = auVar312._0_8_;
              auVar278._12_4_ = auVar312._12_4_;
              aVar389.v[2] = fVar325;
              aVar389.v[3] = fVar394;
              aVar382 = aVar389;
            }
          }
          iVar206 = movmskps(iVar206,auVar278);
          if (iVar206 != 0) {
            fVar291 = (auVar409._0_4_ - auVar331._0_4_) * aVar365.v[0] + auVar331._0_4_;
            fVar301 = (auVar409._4_4_ - auVar331._4_4_) * aVar365.v[1] + auVar331._4_4_;
            fVar313 = (auVar409._8_4_ - auVar331._8_4_) * aVar365.v[2] + auVar331._8_4_;
            fVar314 = (auVar409._12_4_ - auVar331._12_4_) * aVar365.v[3] + auVar331._12_4_;
            fVar217 = *(float *)((long)local_3d0->ray_space + k * 4 + -0x10);
            aVar202._0_4_ = -(uint)(fVar217 * (fVar291 + fVar291) < aVar382.v[0]) & auVar278._0_4_;
            aVar202._4_4_ = -(uint)(fVar217 * (fVar301 + fVar301) < aVar382.v[1]) & auVar278._4_4_;
            aVar202._8_4_ = -(uint)(fVar217 * (fVar313 + fVar313) < aVar382.v[2]) & auVar278._8_4_;
            aVar202._12_4_ = -(uint)(fVar217 * (fVar314 + fVar314) < aVar382.v[3]) & auVar278._12_4_
            ;
            uVar138 = movmskps((int)local_3d0,(undefined1  [16])aVar202);
            if (uVar138 != 0) {
              local_278 = local_278 + local_278 + -1.0;
              fStack_274 = fStack_274 + fStack_274 + -1.0;
              fStack_270 = fStack_270 + fStack_270 + -1.0;
              fStack_26c = fStack_26c + fStack_26c + -1.0;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar339,fVar379);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar417,fVar390);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fVar404,fVar402);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar406,fVar405);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fVar359,fVar357);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar393,fVar392);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fVar348,fVar346);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar355,fVar350);
              pGVar26 = (context->scene->geometries).items[local_3c8].ptr;
              uVar131 = local_3c8;
              bhit.U.field_0 = aVar365;
              bhit.V.field_0.v[0] = local_278;
              bhit.V.field_0.v[1] = fStack_274;
              bhit.V.field_0.v[2] = fStack_270;
              bhit.V.field_0.v[3] = fStack_26c;
              bhit.T.field_0 = aVar382;
              bhit.i = uVar139;
              bhit.valid.field_0 = aVar202;
              if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar130 = (RTCIntersectArguments *)0x0;
                bhit.N = iVar281;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (pRVar130 = (RTCIntersectArguments *)
                                  CONCAT71((int7)((ulong)context->args >> 8),1), bhit.N = iVar281,
                      pGVar26->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar217 = (float)(int)uVar139;
                bhit.vu.field_0.v[0] = (fVar217 + aVar365.v[0] + 0.0) * local_98;
                bhit.vu.field_0.v[1] = (fVar217 + aVar365.v[1] + 1.0) * fStack_94;
                bhit.vu.field_0.v[2] = (fVar217 + aVar365.v[2] + 2.0) * fStack_90;
                bhit.vu.field_0.v[3] = (fVar217 + aVar365.v[3] + 3.0) * fStack_8c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_274,local_278);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_26c,fStack_270);
                bhit.vt.field_0 = aVar382;
                uVar131 = (ulong)(uVar138 & 0xff);
                uVar135 = 0;
                if (uVar131 != 0) {
                  for (; ((uVar138 & 0xff) >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                  }
                }
                auVar173 = *local_350;
                bhit.N = iVar281;
                while (uVar131 != 0) {
                  local_f8 = bhit.vu.field_0.v[uVar135];
                  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_e8 = bhit.vv.field_0.v[uVar135];
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar135];
                  fVar314 = 1.0 - local_f8;
                  fVar217 = local_f8 * 3.0;
                  fVar313 = ((fVar217 + 2.0) * (fVar314 + fVar314) + fVar314 * -3.0 * fVar314) * 0.5
                  ;
                  fVar291 = (local_f8 * local_f8 + fVar314 * -2.0 * local_f8) * 0.5;
                  fVar301 = (local_f8 * fVar217 + (fVar217 + -5.0) * (local_f8 + local_f8)) * 0.5;
                  args.context = context->user;
                  fVar217 = (local_f8 * (fVar314 + fVar314) - fVar314 * fVar314) * 0.5;
                  local_128 = fVar217 * fVar379 +
                              fVar301 * fVar402 + fVar313 * fVar357 + fVar291 * fVar346;
                  local_118 = fVar217 * fVar339 +
                              fVar301 * fVar404 + fVar313 * fVar359 + fVar291 * fVar348;
                  local_108 = fVar217 * fVar390 +
                              fVar301 * fVar405 + fVar313 * fVar392 + fVar291 * fVar350;
                  fStack_124 = local_128;
                  fStack_120 = local_128;
                  fStack_11c = local_128;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  local_d8 = CONCAT44(uStack_84,local_88);
                  uStack_d0 = CONCAT44(uStack_7c,uStack_80);
                  local_c8 = CONCAT44(uStack_74,local_78);
                  uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                  local_b8 = (args.context)->instID[0];
                  uStack_b4 = local_b8;
                  uStack_b0 = local_b8;
                  uStack_ac = local_b8;
                  local_a8 = (args.context)->instPrimID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  args.valid = (int *)local_3e8;
                  pRVar130 = (RTCIntersectArguments *)pGVar26->userPtr;
                  args.hit = (RTCHitN *)&local_128;
                  args.N = 4;
                  p_Var127 = pGVar26->occlusionFilterN;
                  local_3e8 = auVar173;
                  args.geometryUserPtr = pRVar130;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var127 != (RTCFilterFunctionN)0x0) {
                    p_Var127 = (RTCFilterFunctionN)(*p_Var127)(&args);
                  }
                  auVar246._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                  auVar246._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                  auVar246._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                  auVar246._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                  uVar138 = movmskps((int)p_Var127,auVar246);
                  pRVar128 = (RTCRayN *)(ulong)(uVar138 ^ 0xf);
                  if ((uVar138 ^ 0xf) == 0) {
                    auVar246 = auVar246 ^ _DAT_01f46b70;
                  }
                  else {
                    pRVar130 = context->args;
                    if ((pRVar130->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar130->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar130->filter)(&args);
                    }
                    auVar203._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                    auVar203._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                    auVar203._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                    auVar203._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                    auVar246 = auVar203 ^ _DAT_01f46b70;
                    *(undefined1 (*) [16])(args.ray + 0x80) =
                         ~auVar203 & _DAT_01f45a40 |
                         *(undefined1 (*) [16])(args.ray + 0x80) & auVar203;
                    pRVar128 = args.ray;
                  }
                  auVar247._0_4_ = auVar246._0_4_ << 0x1f;
                  auVar247._4_4_ = auVar246._4_4_ << 0x1f;
                  auVar247._8_4_ = auVar246._8_4_ << 0x1f;
                  auVar247._12_4_ = auVar246._12_4_ << 0x1f;
                  iVar206 = movmskps((int)pRVar128,auVar247);
                  if (iVar206 != 0) {
                    pRVar130 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar130 >> 8),1);
                    goto LAB_003cc771;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
                  uVar131 = uVar131 ^ 1L << (uVar135 & 0x3f);
                  uVar135 = 0;
                  if (uVar131 != 0) {
                    for (; (uVar131 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                    }
                  }
                }
                pRVar130 = (RTCIntersectArguments *)0x0;
              }
LAB_003cc771:
              bVar136 = bVar136 | (byte)pRVar130;
            }
          }
        }
      }
    }
    if (bVar136 != 0) break;
    fVar210 = *(float *)(ray + k * 4 + 0x80);
    auVar245._4_4_ = -(uint)(fStack_44 <= fVar210);
    auVar245._0_4_ = -(uint)(local_48 <= fVar210);
    auVar245._8_4_ = -(uint)(fStack_40 <= fVar210);
    auVar245._12_4_ = -(uint)(fStack_3c <= fVar210);
    uVar138 = movmskps(uVar133,auVar245);
  }
  return uVar134 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }